

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<8,8>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  uint uVar14;
  int iVar15;
  undefined4 uVar16;
  __int_type_conflict _Var17;
  long lVar18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  ulong uVar28;
  undefined8 uVar29;
  long lVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  undefined1 auVar74 [32];
  byte bVar75;
  ulong uVar76;
  uint uVar77;
  uint uVar78;
  long lVar79;
  long lVar80;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  Geometry *pGVar81;
  uint uVar82;
  ulong uVar83;
  byte bVar84;
  ulong uVar85;
  float fVar86;
  float fVar87;
  float fVar138;
  float fVar140;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar94 [16];
  float fVar139;
  float fVar141;
  float fVar143;
  float fVar144;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar95 [16];
  float fVar142;
  float fVar145;
  float fVar146;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar147;
  float fVar148;
  undefined4 uVar149;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar166;
  float fVar167;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar169 [16];
  undefined8 uVar168;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar172;
  float fVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar180;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar203 [64];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  RTCFilterFunctionNArguments local_678;
  undefined1 (*local_648) [32];
  undefined1 local_640 [32];
  LinearSpace3fa *local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  int local_3bc;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  int local_260;
  int iStack_25c;
  int iStack_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int iStack_248;
  int iStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  
  PVar13 = prim[1];
  uVar76 = (ulong)(byte)PVar13;
  lVar30 = uVar76 * 0x25;
  fVar173 = *(float *)(prim + lVar30 + 0x12);
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar150 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar169 = vsubps_avx(auVar89,*(undefined1 (*) [16])(prim + lVar30 + 6));
  fVar180 = fVar173 * auVar169._0_4_;
  fVar147 = fVar173 * auVar150._0_4_;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar76 * 4 + 6);
  auVar102 = vpmovsxbd_avx2(auVar89);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar76 * 5 + 6);
  auVar99 = vpmovsxbd_avx2(auVar88);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar76 * 6 + 6);
  auVar100 = vpmovsxbd_avx2(auVar6);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar76 * 0xf + 6);
  auVar101 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  auVar106 = vpmovsxbd_avx2(auVar8);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar112 = vcvtdq2ps_avx(auVar106);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar76 + 6);
  auVar103 = vpmovsxbd_avx2(auVar9);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar76 * 0x1a + 6);
  auVar104 = vpmovsxbd_avx2(auVar10);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar76 * 0x1b + 6);
  auVar111 = vpmovsxbd_avx2(auVar11);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar76 * 0x1c + 6);
  auVar98 = vpmovsxbd_avx2(auVar12);
  auVar105 = vcvtdq2ps_avx(auVar98);
  auVar200._4_4_ = fVar147;
  auVar200._0_4_ = fVar147;
  auVar200._8_4_ = fVar147;
  auVar200._12_4_ = fVar147;
  auVar200._16_4_ = fVar147;
  auVar200._20_4_ = fVar147;
  auVar200._24_4_ = fVar147;
  auVar200._28_4_ = fVar147;
  auVar220._8_4_ = 1;
  auVar220._0_8_ = 0x100000001;
  auVar220._12_4_ = 1;
  auVar220._16_4_ = 1;
  auVar220._20_4_ = 1;
  auVar220._24_4_ = 1;
  auVar220._28_4_ = 1;
  auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar108 = ZEXT1632(CONCAT412(fVar173 * auVar150._12_4_,
                                CONCAT48(fVar173 * auVar150._8_4_,
                                         CONCAT44(fVar173 * auVar150._4_4_,fVar147))));
  auVar107 = vpermps_avx2(auVar220,auVar108);
  auVar97 = vpermps_avx512vl(auVar96,auVar108);
  fVar148 = auVar97._0_4_;
  fVar163 = auVar97._4_4_;
  auVar108._4_4_ = fVar163 * auVar100._4_4_;
  auVar108._0_4_ = fVar148 * auVar100._0_4_;
  fVar164 = auVar97._8_4_;
  auVar108._8_4_ = fVar164 * auVar100._8_4_;
  fVar165 = auVar97._12_4_;
  auVar108._12_4_ = fVar165 * auVar100._12_4_;
  fVar166 = auVar97._16_4_;
  auVar108._16_4_ = fVar166 * auVar100._16_4_;
  fVar167 = auVar97._20_4_;
  auVar108._20_4_ = fVar167 * auVar100._20_4_;
  fVar172 = auVar97._24_4_;
  auVar108._24_4_ = fVar172 * auVar100._24_4_;
  auVar108._28_4_ = auVar106._28_4_;
  auVar106._4_4_ = auVar103._4_4_ * fVar163;
  auVar106._0_4_ = auVar103._0_4_ * fVar148;
  auVar106._8_4_ = auVar103._8_4_ * fVar164;
  auVar106._12_4_ = auVar103._12_4_ * fVar165;
  auVar106._16_4_ = auVar103._16_4_ * fVar166;
  auVar106._20_4_ = auVar103._20_4_ * fVar167;
  auVar106._24_4_ = auVar103._24_4_ * fVar172;
  auVar106._28_4_ = auVar98._28_4_;
  auVar98._4_4_ = auVar105._4_4_ * fVar163;
  auVar98._0_4_ = auVar105._0_4_ * fVar148;
  auVar98._8_4_ = auVar105._8_4_ * fVar164;
  auVar98._12_4_ = auVar105._12_4_ * fVar165;
  auVar98._16_4_ = auVar105._16_4_ * fVar166;
  auVar98._20_4_ = auVar105._20_4_ * fVar167;
  auVar98._24_4_ = auVar105._24_4_ * fVar172;
  auVar98._28_4_ = auVar97._28_4_;
  auVar89 = vfmadd231ps_fma(auVar108,auVar107,auVar99);
  auVar88 = vfmadd231ps_fma(auVar106,auVar107,auVar112);
  auVar6 = vfmadd231ps_fma(auVar98,auVar111,auVar107);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar200,auVar102);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar200,auVar101);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar104,auVar200);
  auVar218._4_4_ = fVar180;
  auVar218._0_4_ = fVar180;
  auVar218._8_4_ = fVar180;
  auVar218._12_4_ = fVar180;
  auVar218._16_4_ = fVar180;
  auVar218._20_4_ = fVar180;
  auVar218._24_4_ = fVar180;
  auVar218._28_4_ = fVar180;
  auVar98 = ZEXT1632(CONCAT412(fVar173 * auVar169._12_4_,
                               CONCAT48(fVar173 * auVar169._8_4_,
                                        CONCAT44(fVar173 * auVar169._4_4_,fVar180))));
  auVar106 = vpermps_avx2(auVar220,auVar98);
  auVar98 = vpermps_avx512vl(auVar96,auVar98);
  fVar173 = auVar98._0_4_;
  fVar148 = auVar98._4_4_;
  auVar107._4_4_ = fVar148 * auVar100._4_4_;
  auVar107._0_4_ = fVar173 * auVar100._0_4_;
  fVar163 = auVar98._8_4_;
  auVar107._8_4_ = fVar163 * auVar100._8_4_;
  fVar164 = auVar98._12_4_;
  auVar107._12_4_ = fVar164 * auVar100._12_4_;
  fVar165 = auVar98._16_4_;
  auVar107._16_4_ = fVar165 * auVar100._16_4_;
  fVar166 = auVar98._20_4_;
  auVar107._20_4_ = fVar166 * auVar100._20_4_;
  fVar167 = auVar98._24_4_;
  auVar107._24_4_ = fVar167 * auVar100._24_4_;
  auVar107._28_4_ = fVar147;
  auVar96._4_4_ = auVar103._4_4_ * fVar148;
  auVar96._0_4_ = auVar103._0_4_ * fVar173;
  auVar96._8_4_ = auVar103._8_4_ * fVar163;
  auVar96._12_4_ = auVar103._12_4_ * fVar164;
  auVar96._16_4_ = auVar103._16_4_ * fVar165;
  auVar96._20_4_ = auVar103._20_4_ * fVar166;
  auVar96._24_4_ = auVar103._24_4_ * fVar167;
  auVar96._28_4_ = auVar100._28_4_;
  auVar103._4_4_ = auVar105._4_4_ * fVar148;
  auVar103._0_4_ = auVar105._0_4_ * fVar173;
  auVar103._8_4_ = auVar105._8_4_ * fVar163;
  auVar103._12_4_ = auVar105._12_4_ * fVar164;
  auVar103._16_4_ = auVar105._16_4_ * fVar165;
  auVar103._20_4_ = auVar105._20_4_ * fVar166;
  auVar103._24_4_ = auVar105._24_4_ * fVar167;
  auVar103._28_4_ = auVar98._28_4_;
  auVar7 = vfmadd231ps_fma(auVar107,auVar106,auVar99);
  auVar8 = vfmadd231ps_fma(auVar96,auVar106,auVar112);
  auVar9 = vfmadd231ps_fma(auVar103,auVar106,auVar111);
  auVar150 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar218,auVar102);
  auVar169 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar218,auVar101);
  auVar208._8_4_ = 0x7fffffff;
  auVar208._0_8_ = 0x7fffffff7fffffff;
  auVar208._12_4_ = 0x7fffffff;
  auVar208._16_4_ = 0x7fffffff;
  auVar208._20_4_ = 0x7fffffff;
  auVar208._24_4_ = 0x7fffffff;
  auVar208._28_4_ = 0x7fffffff;
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar218,auVar104);
  auVar102 = vandps_avx(auVar208,ZEXT1632(auVar89));
  auVar205._8_4_ = 0x219392ef;
  auVar205._0_8_ = 0x219392ef219392ef;
  auVar205._12_4_ = 0x219392ef;
  auVar205._16_4_ = 0x219392ef;
  auVar205._20_4_ = 0x219392ef;
  auVar205._24_4_ = 0x219392ef;
  auVar205._28_4_ = 0x219392ef;
  uVar83 = vcmpps_avx512vl(auVar102,auVar205,1);
  bVar21 = (bool)((byte)uVar83 & 1);
  auVar97._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar89._0_4_;
  bVar21 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar89._4_4_;
  bVar21 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar89._8_4_;
  bVar21 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar89._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar83 >> 7) * 0x219392ef;
  auVar102 = vandps_avx(auVar208,ZEXT1632(auVar88));
  uVar83 = vcmpps_avx512vl(auVar102,auVar205,1);
  bVar21 = (bool)((byte)uVar83 & 1);
  auVar109._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar88._0_4_;
  bVar21 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar88._4_4_;
  bVar21 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar88._8_4_;
  bVar21 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar88._12_4_;
  auVar109._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * 0x219392ef;
  auVar109._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * 0x219392ef;
  auVar109._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * 0x219392ef;
  auVar109._28_4_ = (uint)(byte)(uVar83 >> 7) * 0x219392ef;
  auVar102 = vandps_avx(auVar208,ZEXT1632(auVar6));
  uVar83 = vcmpps_avx512vl(auVar102,auVar205,1);
  bVar21 = (bool)((byte)uVar83 & 1);
  auVar102._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar6._0_4_;
  bVar21 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar6._4_4_;
  bVar21 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar6._8_4_;
  bVar21 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar6._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar83 >> 7) * 0x219392ef;
  auVar99 = vrcp14ps_avx512vl(auVar97);
  auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar227 = ZEXT3264(auVar100);
  auVar101 = vfnmadd213ps_avx512vl(auVar97,auVar99,auVar100);
  auVar89 = vfmadd132ps_fma(auVar101,auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar109);
  auVar101 = vfnmadd213ps_avx512vl(auVar109,auVar99,auVar100);
  auVar88 = vfmadd132ps_fma(auVar101,auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar102);
  auVar102 = vfnmadd213ps_avx512vl(auVar102,auVar99,auVar100);
  auVar6 = vfmadd132ps_fma(auVar102,auVar99,auVar99);
  fVar173 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar30 + 0x16)) *
            *(float *)(prim + lVar30 + 0x1a);
  auVar204._4_4_ = fVar173;
  auVar204._0_4_ = fVar173;
  auVar204._8_4_ = fVar173;
  auVar204._12_4_ = fVar173;
  auVar204._16_4_ = fVar173;
  auVar204._20_4_ = fVar173;
  auVar204._24_4_ = fVar173;
  auVar204._28_4_ = fVar173;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 7 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0xb + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar102);
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 9 + 6));
  auVar7 = vfmadd213ps_fma(auVar99,auVar204,auVar102);
  auVar102 = vcvtdq2ps_avx(auVar100);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0xd + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar102);
  auVar8 = vfmadd213ps_fma(auVar99,auVar204,auVar102);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x12 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  uVar83 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 2 + uVar83 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar102);
  auVar9 = vfmadd213ps_fma(auVar99,auVar204,auVar102);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x18 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar102);
  auVar10 = vfmadd213ps_fma(auVar99,auVar204,auVar102);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x1d + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 + (ulong)(byte)PVar13 * 0x20 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar102);
  auVar11 = vfmadd213ps_fma(auVar99,auVar204,auVar102);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar13 * 0x20 - uVar76) + 6)
                           );
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x23 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar102);
  auVar12 = vfmadd213ps_fma(auVar99,auVar204,auVar102);
  auVar102 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar150));
  auVar104._4_4_ = auVar89._4_4_ * auVar102._4_4_;
  auVar104._0_4_ = auVar89._0_4_ * auVar102._0_4_;
  auVar104._8_4_ = auVar89._8_4_ * auVar102._8_4_;
  auVar104._12_4_ = auVar89._12_4_ * auVar102._12_4_;
  auVar104._16_4_ = auVar102._16_4_ * 0.0;
  auVar104._20_4_ = auVar102._20_4_ * 0.0;
  auVar104._24_4_ = auVar102._24_4_ * 0.0;
  auVar104._28_4_ = auVar102._28_4_;
  auVar102 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar150));
  auVar178._0_4_ = auVar89._0_4_ * auVar102._0_4_;
  auVar178._4_4_ = auVar89._4_4_ * auVar102._4_4_;
  auVar178._8_4_ = auVar89._8_4_ * auVar102._8_4_;
  auVar178._12_4_ = auVar89._12_4_ * auVar102._12_4_;
  auVar178._16_4_ = auVar102._16_4_ * 0.0;
  auVar178._20_4_ = auVar102._20_4_ * 0.0;
  auVar178._24_4_ = auVar102._24_4_ * 0.0;
  auVar178._28_4_ = 0;
  auVar102 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar169));
  auVar111._4_4_ = auVar88._4_4_ * auVar102._4_4_;
  auVar111._0_4_ = auVar88._0_4_ * auVar102._0_4_;
  auVar111._8_4_ = auVar88._8_4_ * auVar102._8_4_;
  auVar111._12_4_ = auVar88._12_4_ * auVar102._12_4_;
  auVar111._16_4_ = auVar102._16_4_ * 0.0;
  auVar111._20_4_ = auVar102._20_4_ * 0.0;
  auVar111._24_4_ = auVar102._24_4_ * 0.0;
  auVar111._28_4_ = auVar102._28_4_;
  auVar102 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar169));
  auVar170._0_4_ = auVar88._0_4_ * auVar102._0_4_;
  auVar170._4_4_ = auVar88._4_4_ * auVar102._4_4_;
  auVar170._8_4_ = auVar88._8_4_ * auVar102._8_4_;
  auVar170._12_4_ = auVar88._12_4_ * auVar102._12_4_;
  auVar170._16_4_ = auVar102._16_4_ * 0.0;
  auVar170._20_4_ = auVar102._20_4_ * 0.0;
  auVar170._24_4_ = auVar102._24_4_ * 0.0;
  auVar170._28_4_ = 0;
  auVar102 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar90));
  auVar105._4_4_ = auVar6._4_4_ * auVar102._4_4_;
  auVar105._0_4_ = auVar6._0_4_ * auVar102._0_4_;
  auVar105._8_4_ = auVar6._8_4_ * auVar102._8_4_;
  auVar105._12_4_ = auVar6._12_4_ * auVar102._12_4_;
  auVar105._16_4_ = auVar102._16_4_ * 0.0;
  auVar105._20_4_ = auVar102._20_4_ * 0.0;
  auVar105._24_4_ = auVar102._24_4_ * 0.0;
  auVar105._28_4_ = auVar102._28_4_;
  auVar102 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar90));
  auVar110._0_4_ = auVar6._0_4_ * auVar102._0_4_;
  auVar110._4_4_ = auVar6._4_4_ * auVar102._4_4_;
  auVar110._8_4_ = auVar6._8_4_ * auVar102._8_4_;
  auVar110._12_4_ = auVar6._12_4_ * auVar102._12_4_;
  auVar110._16_4_ = auVar102._16_4_ * 0.0;
  auVar110._20_4_ = auVar102._20_4_ * 0.0;
  auVar110._24_4_ = auVar102._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar102 = vpminsd_avx2(auVar104,auVar178);
  auVar99 = vpminsd_avx2(auVar111,auVar170);
  auVar102 = vmaxps_avx(auVar102,auVar99);
  auVar99 = vpminsd_avx2(auVar105,auVar110);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar100._4_4_ = uVar149;
  auVar100._0_4_ = uVar149;
  auVar100._8_4_ = uVar149;
  auVar100._12_4_ = uVar149;
  auVar100._16_4_ = uVar149;
  auVar100._20_4_ = uVar149;
  auVar100._24_4_ = uVar149;
  auVar100._28_4_ = uVar149;
  auVar99 = vmaxps_avx512vl(auVar99,auVar100);
  auVar102 = vmaxps_avx(auVar102,auVar99);
  auVar99._8_4_ = 0x3f7ffffa;
  auVar99._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar99._12_4_ = 0x3f7ffffa;
  auVar99._16_4_ = 0x3f7ffffa;
  auVar99._20_4_ = 0x3f7ffffa;
  auVar99._24_4_ = 0x3f7ffffa;
  auVar99._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar102,auVar99);
  auVar102 = vpmaxsd_avx2(auVar104,auVar178);
  auVar99 = vpmaxsd_avx2(auVar111,auVar170);
  auVar102 = vminps_avx(auVar102,auVar99);
  auVar99 = vpmaxsd_avx2(auVar105,auVar110);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar101._4_4_ = uVar149;
  auVar101._0_4_ = uVar149;
  auVar101._8_4_ = uVar149;
  auVar101._12_4_ = uVar149;
  auVar101._16_4_ = uVar149;
  auVar101._20_4_ = uVar149;
  auVar101._24_4_ = uVar149;
  auVar101._28_4_ = uVar149;
  auVar99 = vminps_avx512vl(auVar99,auVar101);
  auVar102 = vminps_avx(auVar102,auVar99);
  auVar112._8_4_ = 0x3f800003;
  auVar112._0_8_ = 0x3f8000033f800003;
  auVar112._12_4_ = 0x3f800003;
  auVar112._16_4_ = 0x3f800003;
  auVar112._20_4_ = 0x3f800003;
  auVar112._24_4_ = 0x3f800003;
  auVar112._28_4_ = 0x3f800003;
  auVar102 = vmulps_avx512vl(auVar102,auVar112);
  auVar99 = vpbroadcastd_avx512vl();
  uVar29 = vpcmpgtd_avx512vl(auVar99,_DAT_01fe9900);
  uVar168 = vcmpps_avx512vl(local_80,auVar102,2);
  if ((byte)((byte)uVar168 & (byte)uVar29) != 0) {
    uVar83 = (ulong)(byte)((byte)uVar168 & (byte)uVar29);
    local_608 = pre->ray_space + k;
    local_648 = (undefined1 (*) [32])&local_180;
    local_300 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar228 = ZEXT464(0xbf800000);
    do {
      auVar102 = local_580;
      lVar30 = 0;
      for (uVar76 = uVar83; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar82 = *(uint *)(prim + 2);
      uVar14 = *(uint *)(prim + lVar30 * 4 + 6);
      pGVar81 = (context->scene->geometries).items[uVar82].ptr;
      uVar76 = (ulong)*(uint *)(*(long *)&pGVar81->field_0x58 +
                               (ulong)uVar14 *
                               pGVar81[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar173 = (pGVar81->time_range).lower;
      fVar173 = pGVar81->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar173) /
                ((pGVar81->time_range).upper - fVar173));
      auVar89 = vroundss_avx(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),9);
      auVar88 = vaddss_avx512f(ZEXT416((uint)pGVar81->fnumTimeSegments),auVar228._0_16_);
      auVar89 = vminss_avx(auVar89,auVar88);
      auVar89 = vmaxss_avx(ZEXT816(0) << 0x20,auVar89);
      fVar173 = fVar173 - auVar89._0_4_;
      fVar147 = 1.0 - fVar173;
      _Var17 = pGVar81[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar79 = (long)(int)auVar89._0_4_ * 0x38;
      lVar80 = *(long *)(_Var17 + 0x10 + lVar79);
      lVar18 = *(long *)(_Var17 + 0x38 + lVar79);
      lVar19 = *(long *)(_Var17 + 0x48 + lVar79);
      auVar150._4_4_ = fVar173;
      auVar150._0_4_ = fVar173;
      auVar150._8_4_ = fVar173;
      auVar150._12_4_ = fVar173;
      pfVar3 = (float *)(lVar18 + lVar19 * uVar76);
      auVar90._0_4_ = fVar173 * *pfVar3;
      auVar90._4_4_ = fVar173 * pfVar3[1];
      auVar90._8_4_ = fVar173 * pfVar3[2];
      auVar90._12_4_ = fVar173 * pfVar3[3];
      lVar30 = uVar76 + 1;
      auVar89 = vmulps_avx512vl(auVar150,*(undefined1 (*) [16])(lVar18 + lVar19 * lVar30));
      p_Var20 = pGVar81[4].occlusionFilterN;
      auVar169._4_4_ = fVar147;
      auVar169._0_4_ = fVar147;
      auVar169._8_4_ = fVar147;
      auVar169._12_4_ = fVar147;
      auVar7 = vfmadd231ps_fma(auVar90,auVar169,
                               *(undefined1 (*) [16])(*(long *)(_Var17 + lVar79) + lVar80 * uVar76))
      ;
      auVar90 = vfmadd231ps_avx512vl
                          (auVar89,auVar169,
                           *(undefined1 (*) [16])(*(long *)(_Var17 + lVar79) + lVar80 * lVar30));
      pfVar3 = (float *)(*(long *)(p_Var20 + lVar79 + 0x38) +
                        uVar76 * *(long *)(p_Var20 + lVar79 + 0x48));
      auVar211._0_4_ = fVar173 * *pfVar3;
      auVar211._4_4_ = fVar173 * pfVar3[1];
      auVar211._8_4_ = fVar173 * pfVar3[2];
      auVar211._12_4_ = fVar173 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var20 + lVar79 + 0x38) +
                        *(long *)(p_Var20 + lVar79 + 0x48) * lVar30);
      auVar215._0_4_ = fVar173 * *pfVar3;
      auVar215._4_4_ = fVar173 * pfVar3[1];
      auVar215._8_4_ = fVar173 * pfVar3[2];
      auVar215._12_4_ = fVar173 * pfVar3[3];
      auVar88 = vfmadd231ps_fma(auVar211,auVar169,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var20 + lVar79) +
                                 *(long *)(p_Var20 + lVar79 + 0x10) * uVar76));
      auVar6 = vfmadd231ps_fma(auVar215,auVar169,
                               *(undefined1 (*) [16])
                                (*(long *)(p_Var20 + lVar79) +
                                *(long *)(p_Var20 + lVar79 + 0x10) * lVar30));
      iVar15 = (int)pGVar81[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      lVar30 = (long)iVar15 * 0x44;
      auVar91._8_4_ = 0xbeaaaaab;
      auVar91._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar91._12_4_ = 0xbeaaaaab;
      auVar169 = vfnmadd213ps_fma(auVar88,auVar91,auVar7);
      auVar91 = vfmadd213ps_avx512vl(auVar6,auVar91,auVar90);
      auVar6 = vsubps_avx(auVar7,auVar89);
      uVar149 = auVar6._0_4_;
      auVar93._4_4_ = uVar149;
      auVar93._0_4_ = uVar149;
      auVar93._8_4_ = uVar149;
      auVar93._12_4_ = uVar149;
      auVar88 = vshufps_avx(auVar6,auVar6,0x55);
      aVar4 = (local_608->vx).field_0;
      aVar5 = (local_608->vy).field_0;
      fVar173 = (local_608->vz).field_0.m128[0];
      fVar147 = *(float *)((long)&(local_608->vz).field_0 + 4);
      fVar148 = *(float *)((long)&(local_608->vz).field_0 + 8);
      fVar163 = *(float *)((long)&(local_608->vz).field_0 + 0xc);
      auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
      auVar214._0_4_ = fVar173 * auVar6._0_4_;
      auVar214._4_4_ = fVar147 * auVar6._4_4_;
      auVar214._8_4_ = fVar148 * auVar6._8_4_;
      auVar214._12_4_ = fVar163 * auVar6._12_4_;
      auVar88 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar5,auVar88);
      auVar8 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar4,auVar93);
      auVar6 = vsubps_avx(auVar169,auVar89);
      uVar149 = auVar6._0_4_;
      auVar94._4_4_ = uVar149;
      auVar94._0_4_ = uVar149;
      auVar94._8_4_ = uVar149;
      auVar94._12_4_ = uVar149;
      auVar88 = vshufps_avx(auVar6,auVar6,0x55);
      auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
      auVar216._0_4_ = fVar173 * auVar6._0_4_;
      auVar216._4_4_ = fVar147 * auVar6._4_4_;
      auVar216._8_4_ = fVar148 * auVar6._8_4_;
      auVar216._12_4_ = fVar163 * auVar6._12_4_;
      auVar88 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar5,auVar88);
      auVar9 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar4,auVar94);
      auVar6 = vsubps_avx(auVar91,auVar89);
      uVar149 = auVar6._0_4_;
      auVar95._4_4_ = uVar149;
      auVar95._0_4_ = uVar149;
      auVar95._8_4_ = uVar149;
      auVar95._12_4_ = uVar149;
      auVar88 = vshufps_avx(auVar6,auVar6,0x55);
      auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
      auVar217._0_4_ = fVar173 * auVar6._0_4_;
      auVar217._4_4_ = fVar147 * auVar6._4_4_;
      auVar217._8_4_ = fVar148 * auVar6._8_4_;
      auVar217._12_4_ = fVar163 * auVar6._12_4_;
      auVar88 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar5,auVar88);
      auVar6 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar4,auVar95);
      auVar88 = vsubps_avx512vl(auVar90,auVar89);
      uVar149 = auVar88._0_4_;
      auVar92._4_4_ = uVar149;
      auVar92._0_4_ = uVar149;
      auVar92._8_4_ = uVar149;
      auVar92._12_4_ = uVar149;
      auVar89 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar219._0_4_ = fVar173 * auVar88._0_4_;
      auVar219._4_4_ = fVar147 * auVar88._4_4_;
      auVar219._8_4_ = fVar148 * auVar88._8_4_;
      auVar219._12_4_ = fVar163 * auVar88._12_4_;
      auVar89 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar5,auVar89);
      auVar10 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar92);
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar30);
      uVar149 = auVar8._0_4_;
      local_440._4_4_ = uVar149;
      local_440._0_4_ = uVar149;
      local_440._8_4_ = uVar149;
      local_440._12_4_ = uVar149;
      local_440._16_4_ = uVar149;
      local_440._20_4_ = uVar149;
      local_440._24_4_ = uVar149;
      local_440._28_4_ = uVar149;
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x484);
      auVar155._8_4_ = 1;
      auVar155._0_8_ = 0x100000001;
      auVar155._12_4_ = 1;
      auVar155._16_4_ = 1;
      auVar155._20_4_ = 1;
      auVar155._24_4_ = 1;
      auVar155._28_4_ = 1;
      local_460 = vpermps_avx2(auVar155,ZEXT1632(auVar8));
      uVar149 = auVar9._0_4_;
      auVar181._4_4_ = uVar149;
      auVar181._0_4_ = uVar149;
      auVar181._8_4_ = uVar149;
      auVar181._12_4_ = uVar149;
      local_480._16_4_ = uVar149;
      local_480._0_16_ = auVar181;
      local_480._20_4_ = uVar149;
      local_480._24_4_ = uVar149;
      local_480._28_4_ = uVar149;
      local_4a0 = vpermps_avx512vl(auVar155,ZEXT1632(auVar9));
      auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x908);
      local_4c0 = vbroadcastss_avx512vl(auVar6);
      local_4e0 = vpermps_avx512vl(auVar155,ZEXT1632(auVar6));
      auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0xd8c);
      uVar149 = auVar10._0_4_;
      local_500._4_4_ = uVar149;
      local_500._0_4_ = uVar149;
      fStack_4f8 = (float)uVar149;
      fStack_4f4 = (float)uVar149;
      fStack_4f0 = (float)uVar149;
      fStack_4ec = (float)uVar149;
      fStack_4e8 = (float)uVar149;
      register0x0000139c = uVar149;
      _local_520 = vpermps_avx512vl(auVar155,ZEXT1632(auVar10));
      auVar103 = vmulps_avx512vl(_local_500,auVar112);
      auVar104 = vmulps_avx512vl(_local_520,auVar112);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar101,local_4c0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,local_4e0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar100,local_480);
      auVar105 = vfmadd231ps_avx512vl(auVar104,auVar100,local_4a0);
      auVar106 = vfmadd231ps_avx512vl(auVar103,auVar99,local_440);
      auVar203 = ZEXT3264(auVar106);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar30);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x484);
      auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x908);
      auVar98 = vfmadd231ps_avx512vl(auVar105,auVar99,local_460);
      auVar193 = ZEXT3264(auVar98);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0xd8c);
      auVar107 = vmulps_avx512vl(_local_500,auVar105);
      auVar108 = vmulps_avx512vl(_local_520,auVar105);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar111,local_4c0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar111,local_4e0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar104,local_480);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,local_4a0);
      auVar11 = vfmadd231ps_fma(auVar107,auVar103,local_440);
      auVar206 = ZEXT1664(auVar11);
      auVar12 = vfmadd231ps_fma(auVar108,auVar103,local_460);
      auVar107 = vsubps_avx512vl(ZEXT1632(auVar11),auVar106);
      auVar108 = vsubps_avx512vl(ZEXT1632(auVar12),auVar98);
      auVar96 = vmulps_avx512vl(auVar98,auVar107);
      auVar97 = vmulps_avx512vl(auVar106,auVar108);
      auVar96 = vsubps_avx512vl(auVar96,auVar97);
      auVar89 = vshufps_avx(auVar7,auVar7,0xff);
      uVar168 = auVar89._0_8_;
      local_a0._8_8_ = uVar168;
      local_a0._0_8_ = uVar168;
      local_a0._16_8_ = uVar168;
      local_a0._24_8_ = uVar168;
      auVar89 = vshufps_avx(auVar169,auVar169,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar89);
      auVar89 = vshufps_avx(auVar91,auVar91,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar89);
      auVar89 = vshufps_avx512vl(auVar90,auVar90,0xff);
      uVar168 = auVar89._0_8_;
      local_100._8_8_ = uVar168;
      local_100._0_8_ = uVar168;
      local_100._16_8_ = uVar168;
      local_100._24_8_ = uVar168;
      auVar97 = vmulps_avx512vl(local_100,auVar112);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar101,local_e0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,local_c0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar99,local_a0);
      auVar109 = vmulps_avx512vl(local_100,auVar105);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar111,local_e0);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar104,local_c0);
      auVar150 = vfmadd231ps_fma(auVar109,auVar103,local_a0);
      auVar109 = vmulps_avx512vl(auVar108,auVar108);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar107,auVar107);
      auVar110 = vmaxps_avx512vl(auVar97,ZEXT1632(auVar150));
      auVar110 = vmulps_avx512vl(auVar110,auVar110);
      auVar109 = vmulps_avx512vl(auVar110,auVar109);
      auVar96 = vmulps_avx512vl(auVar96,auVar96);
      uVar168 = vcmpps_avx512vl(auVar96,auVar109,2);
      auVar89 = vblendps_avx(auVar8,auVar7,8);
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar88 = vandps_avx512vl(auVar89,auVar92);
      auVar89 = vblendps_avx(auVar9,auVar169,8);
      auVar89 = vandps_avx512vl(auVar89,auVar92);
      auVar88 = vmaxps_avx(auVar88,auVar89);
      auVar89 = vblendps_avx(auVar6,auVar91,8);
      auVar93 = vandps_avx512vl(auVar89,auVar92);
      auVar89 = vblendps_avx(auVar10,auVar90,8);
      auVar89 = vandps_avx512vl(auVar89,auVar92);
      auVar89 = vmaxps_avx(auVar93,auVar89);
      auVar89 = vmaxps_avx(auVar88,auVar89);
      auVar88 = vmovshdup_avx(auVar89);
      auVar88 = vmaxss_avx(auVar88,auVar89);
      auVar89 = vshufpd_avx(auVar89,auVar89,1);
      auVar89 = vmaxss_avx(auVar89,auVar88);
      auVar209._0_4_ = (float)iVar15;
      local_580._4_12_ = auVar91._4_12_;
      local_580._0_4_ = auVar209._0_4_;
      local_580._16_16_ = auVar102._16_16_;
      auVar209._4_4_ = auVar209._0_4_;
      auVar209._8_4_ = auVar209._0_4_;
      auVar209._12_4_ = auVar209._0_4_;
      auVar209._16_4_ = auVar209._0_4_;
      auVar209._20_4_ = auVar209._0_4_;
      auVar209._24_4_ = auVar209._0_4_;
      auVar209._28_4_ = auVar209._0_4_;
      uVar29 = vcmpps_avx512vl(auVar209,_DAT_01faff40,0xe);
      bVar84 = (byte)uVar168 & (byte)uVar29;
      fVar173 = auVar89._0_4_ * 4.7683716e-07;
      local_5e0._0_16_ = ZEXT416((uint)fVar173);
      auVar210._8_4_ = 2;
      auVar210._0_8_ = 0x200000002;
      auVar210._12_4_ = 2;
      auVar210._16_4_ = 2;
      auVar210._20_4_ = 2;
      auVar210._24_4_ = 2;
      auVar210._28_4_ = 2;
      local_280 = vpermps_avx2(auVar210,ZEXT1632(auVar8));
      local_2a0 = vpermps_avx2(auVar210,ZEXT1632(auVar9));
      local_2c0 = vpermps_avx2(auVar210,ZEXT1632(auVar6));
      local_2e0 = vpermps_avx2(auVar210,ZEXT1632(auVar10));
      local_560 = *(undefined4 *)(ray + k * 4 + 0x60);
      uStack_55c = 0;
      uStack_558 = 0;
      uStack_554 = 0;
      local_690 = auVar7._0_8_;
      uStack_688 = auVar7._8_8_;
      local_6b0 = auVar169._0_8_;
      uStack_6a8 = auVar169._8_8_;
      local_6c0 = auVar91._0_8_;
      uStack_6b8 = auVar91._8_8_;
      local_6a0._0_4_ = auVar90._0_4_;
      fVar147 = (float)local_6a0;
      local_6a0._4_4_ = auVar90._4_4_;
      fVar148 = local_6a0._4_4_;
      uStack_698._0_4_ = auVar90._8_4_;
      fVar163 = (float)uStack_698;
      uStack_698._4_4_ = auVar90._12_4_;
      fVar164 = uStack_698._4_4_;
      local_6a0 = auVar90._0_8_;
      uStack_698 = auVar90._8_8_;
      if (bVar84 != 0) {
        auVar102 = vmulps_avx512vl(local_2e0,auVar105);
        auVar102 = vfmadd213ps_avx512vl(auVar111,local_2c0,auVar102);
        auVar102 = vfmadd213ps_avx512vl(auVar104,local_2a0,auVar102);
        auVar103 = vfmadd213ps_avx512vl(auVar103,local_280,auVar102);
        auVar102 = vmulps_avx512vl(local_2e0,auVar112);
        auVar102 = vfmadd213ps_avx512vl(auVar101,local_2c0,auVar102);
        auVar104 = vfmadd213ps_avx512vl(auVar100,local_2a0,auVar102);
        auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1210);
        auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1694);
        auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1b18);
        auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1f9c);
        auVar104 = vfmadd213ps_avx512vl(auVar99,local_280,auVar104);
        auVar99 = vmulps_avx512vl(_local_500,auVar112);
        auVar111 = vmulps_avx512vl(_local_520,auVar112);
        auVar112 = vmulps_avx512vl(local_2e0,auVar112);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar101,local_4c0);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar101,local_4e0);
        auVar101 = vfmadd231ps_avx512vl(auVar112,local_2c0,auVar101);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar100,local_480);
        auVar112 = vfmadd231ps_avx512vl(auVar111,auVar100,local_4a0);
        auVar111 = vfmadd231ps_avx512vl(auVar101,local_2a0,auVar100);
        auVar89 = vfmadd231ps_fma(auVar99,auVar102,local_440);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar102,local_460);
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1210);
        auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1b18);
        auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1f9c);
        auVar111 = vfmadd231ps_avx512vl(auVar111,local_280,auVar102);
        auVar102 = vmulps_avx512vl(_local_500,auVar101);
        auVar105 = vmulps_avx512vl(_local_520,auVar101);
        auVar101 = vmulps_avx512vl(local_2e0,auVar101);
        auVar96 = vfmadd231ps_avx512vl(auVar102,auVar100,local_4c0);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,local_4e0);
        auVar100 = vfmadd231ps_avx512vl(auVar101,local_2c0,auVar100);
        auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1694);
        auVar101 = vfmadd231ps_avx512vl(auVar96,auVar102,local_480);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,local_4a0);
        auVar102 = vfmadd231ps_avx512vl(auVar100,local_2a0,auVar102);
        auVar88 = vfmadd231ps_fma(auVar101,auVar99,local_440);
        auVar100 = vfmadd231ps_avx512vl(auVar105,auVar99,local_460);
        auVar101 = vfmadd231ps_avx512vl(auVar102,local_280,auVar99);
        auVar228 = ZEXT1664(auVar228._0_16_);
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar227 = ZEXT3264(auVar105);
        auVar221._8_4_ = 0x7fffffff;
        auVar221._0_8_ = 0x7fffffff7fffffff;
        auVar221._12_4_ = 0x7fffffff;
        auVar221._16_4_ = 0x7fffffff;
        auVar221._20_4_ = 0x7fffffff;
        auVar221._24_4_ = 0x7fffffff;
        auVar221._28_4_ = 0x7fffffff;
        auVar102 = vandps_avx(ZEXT1632(auVar89),auVar221);
        auVar99 = vandps_avx(auVar112,auVar221);
        auVar99 = vmaxps_avx(auVar102,auVar99);
        auVar102 = vandps_avx(auVar111,auVar221);
        auVar102 = vmaxps_avx(auVar99,auVar102);
        auVar212._4_4_ = fVar173;
        auVar212._0_4_ = fVar173;
        auVar212._8_4_ = fVar173;
        auVar212._12_4_ = fVar173;
        auVar212._16_4_ = fVar173;
        auVar212._20_4_ = fVar173;
        auVar212._24_4_ = fVar173;
        auVar212._28_4_ = fVar173;
        uVar76 = vcmpps_avx512vl(auVar102,auVar212,1);
        bVar21 = (bool)((byte)uVar76 & 1);
        auVar113._0_4_ = (float)((uint)bVar21 * auVar107._0_4_ | (uint)!bVar21 * auVar89._0_4_);
        bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar21 * auVar107._4_4_ | (uint)!bVar21 * auVar89._4_4_);
        bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar21 * auVar107._8_4_ | (uint)!bVar21 * auVar89._8_4_);
        bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar21 * auVar107._12_4_ | (uint)!bVar21 * auVar89._12_4_);
        fVar173 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar107._16_4_);
        auVar113._16_4_ = fVar173;
        fVar165 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar107._20_4_);
        auVar113._20_4_ = fVar165;
        fVar166 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar107._24_4_);
        auVar113._24_4_ = fVar166;
        auVar113._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar107._28_4_;
        bVar21 = (bool)((byte)uVar76 & 1);
        auVar114._0_4_ = (float)((uint)bVar21 * auVar108._0_4_ | (uint)!bVar21 * auVar112._0_4_);
        bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar21 * auVar108._4_4_ | (uint)!bVar21 * auVar112._4_4_);
        bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar21 * auVar108._8_4_ | (uint)!bVar21 * auVar112._8_4_);
        bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar21 * auVar108._12_4_ | (uint)!bVar21 * auVar112._12_4_);
        bVar21 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar21 * auVar108._16_4_ | (uint)!bVar21 * auVar112._16_4_);
        bVar21 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar21 * auVar108._20_4_ | (uint)!bVar21 * auVar112._20_4_);
        bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar21 * auVar108._24_4_ | (uint)!bVar21 * auVar112._24_4_);
        bVar21 = SUB81(uVar76 >> 7,0);
        auVar114._28_4_ = (uint)bVar21 * auVar108._28_4_ | (uint)!bVar21 * auVar112._28_4_;
        auVar102 = vandps_avx(auVar221,ZEXT1632(auVar88));
        auVar99 = vandps_avx(auVar100,auVar221);
        auVar99 = vmaxps_avx(auVar102,auVar99);
        auVar102 = vandps_avx(auVar101,auVar221);
        auVar102 = vmaxps_avx(auVar99,auVar102);
        uVar76 = vcmpps_avx512vl(auVar102,auVar212,1);
        bVar21 = (bool)((byte)uVar76 & 1);
        auVar115._0_4_ = (float)((uint)bVar21 * auVar107._0_4_ | (uint)!bVar21 * auVar88._0_4_);
        bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar21 * auVar107._4_4_ | (uint)!bVar21 * auVar88._4_4_);
        bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar21 * auVar107._8_4_ | (uint)!bVar21 * auVar88._8_4_);
        bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar21 * auVar107._12_4_ | (uint)!bVar21 * auVar88._12_4_);
        fVar180 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar107._16_4_);
        auVar115._16_4_ = fVar180;
        fVar172 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar107._20_4_);
        auVar115._20_4_ = fVar172;
        fVar167 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar107._24_4_);
        auVar115._24_4_ = fVar167;
        uVar77 = (uint)(byte)(uVar76 >> 7) * auVar107._28_4_;
        auVar115._28_4_ = uVar77;
        bVar21 = (bool)((byte)uVar76 & 1);
        auVar116._0_4_ = (float)((uint)bVar21 * auVar108._0_4_ | (uint)!bVar21 * auVar100._0_4_);
        bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar21 * auVar108._4_4_ | (uint)!bVar21 * auVar100._4_4_);
        bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar21 * auVar108._8_4_ | (uint)!bVar21 * auVar100._8_4_);
        bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar21 * auVar108._12_4_ | (uint)!bVar21 * auVar100._12_4_);
        bVar21 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar21 * auVar108._16_4_ | (uint)!bVar21 * auVar100._16_4_);
        bVar21 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar21 * auVar108._20_4_ | (uint)!bVar21 * auVar100._20_4_);
        bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar21 * auVar108._24_4_ | (uint)!bVar21 * auVar100._24_4_);
        bVar21 = SUB81(uVar76 >> 7,0);
        auVar116._28_4_ = (uint)bVar21 * auVar108._28_4_ | (uint)!bVar21 * auVar100._28_4_;
        auVar94 = vxorps_avx512vl(auVar181,auVar181);
        auVar102 = vfmadd213ps_avx512vl(auVar113,auVar113,ZEXT1632(auVar94));
        auVar89 = vfmadd231ps_fma(auVar102,auVar114,auVar114);
        auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
        fVar86 = auVar102._0_4_;
        fVar87 = auVar102._4_4_;
        fVar138 = auVar102._8_4_;
        fVar139 = auVar102._12_4_;
        fVar140 = auVar102._16_4_;
        fVar141 = auVar102._20_4_;
        fVar143 = auVar102._24_4_;
        auVar36._4_4_ = fVar87 * fVar87 * fVar87 * auVar89._4_4_ * -0.5;
        auVar36._0_4_ = fVar86 * fVar86 * fVar86 * auVar89._0_4_ * -0.5;
        auVar36._8_4_ = fVar138 * fVar138 * fVar138 * auVar89._8_4_ * -0.5;
        auVar36._12_4_ = fVar139 * fVar139 * fVar139 * auVar89._12_4_ * -0.5;
        auVar36._16_4_ = fVar140 * fVar140 * fVar140 * -0.0;
        auVar36._20_4_ = fVar141 * fVar141 * fVar141 * -0.0;
        auVar36._24_4_ = fVar143 * fVar143 * fVar143 * -0.0;
        auVar36._28_4_ = auVar101._28_4_;
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar102 = vfmadd231ps_avx512vl(auVar36,auVar99,auVar102);
        auVar37._4_4_ = auVar114._4_4_ * auVar102._4_4_;
        auVar37._0_4_ = auVar114._0_4_ * auVar102._0_4_;
        auVar37._8_4_ = auVar114._8_4_ * auVar102._8_4_;
        auVar37._12_4_ = auVar114._12_4_ * auVar102._12_4_;
        auVar37._16_4_ = auVar114._16_4_ * auVar102._16_4_;
        auVar37._20_4_ = auVar114._20_4_ * auVar102._20_4_;
        auVar37._24_4_ = auVar114._24_4_ * auVar102._24_4_;
        auVar37._28_4_ = 0;
        auVar38._4_4_ = auVar102._4_4_ * -auVar113._4_4_;
        auVar38._0_4_ = auVar102._0_4_ * -auVar113._0_4_;
        auVar38._8_4_ = auVar102._8_4_ * -auVar113._8_4_;
        auVar38._12_4_ = auVar102._12_4_ * -auVar113._12_4_;
        auVar38._16_4_ = auVar102._16_4_ * -fVar173;
        auVar38._20_4_ = auVar102._20_4_ * -fVar165;
        auVar38._24_4_ = auVar102._24_4_ * -fVar166;
        auVar38._28_4_ = auVar114._28_4_;
        auVar102 = vmulps_avx512vl(auVar102,ZEXT1632(auVar94));
        auVar107 = ZEXT1632(auVar94);
        auVar100 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar107);
        auVar89 = vfmadd231ps_fma(auVar100,auVar116,auVar116);
        auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
        fVar173 = auVar100._0_4_;
        fVar165 = auVar100._4_4_;
        fVar166 = auVar100._8_4_;
        fVar86 = auVar100._12_4_;
        fVar87 = auVar100._16_4_;
        fVar138 = auVar100._20_4_;
        fVar139 = auVar100._24_4_;
        auVar39._4_4_ = fVar165 * fVar165 * fVar165 * auVar89._4_4_ * -0.5;
        auVar39._0_4_ = fVar173 * fVar173 * fVar173 * auVar89._0_4_ * -0.5;
        auVar39._8_4_ = fVar166 * fVar166 * fVar166 * auVar89._8_4_ * -0.5;
        auVar39._12_4_ = fVar86 * fVar86 * fVar86 * auVar89._12_4_ * -0.5;
        auVar39._16_4_ = fVar87 * fVar87 * fVar87 * -0.0;
        auVar39._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
        auVar39._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar39._28_4_ = 0;
        auVar99 = vfmadd231ps_avx512vl(auVar39,auVar99,auVar100);
        auVar40._4_4_ = auVar116._4_4_ * auVar99._4_4_;
        auVar40._0_4_ = auVar116._0_4_ * auVar99._0_4_;
        auVar40._8_4_ = auVar116._8_4_ * auVar99._8_4_;
        auVar40._12_4_ = auVar116._12_4_ * auVar99._12_4_;
        auVar40._16_4_ = auVar116._16_4_ * auVar99._16_4_;
        auVar40._20_4_ = auVar116._20_4_ * auVar99._20_4_;
        auVar40._24_4_ = auVar116._24_4_ * auVar99._24_4_;
        auVar40._28_4_ = auVar100._28_4_;
        auVar41._4_4_ = -auVar115._4_4_ * auVar99._4_4_;
        auVar41._0_4_ = -auVar115._0_4_ * auVar99._0_4_;
        auVar41._8_4_ = -auVar115._8_4_ * auVar99._8_4_;
        auVar41._12_4_ = -auVar115._12_4_ * auVar99._12_4_;
        auVar41._16_4_ = -fVar180 * auVar99._16_4_;
        auVar41._20_4_ = -fVar172 * auVar99._20_4_;
        auVar41._24_4_ = -fVar167 * auVar99._24_4_;
        auVar41._28_4_ = uVar77 ^ 0x80000000;
        auVar99 = vmulps_avx512vl(auVar99,auVar107);
        auVar89 = vfmadd213ps_fma(auVar37,auVar97,auVar106);
        auVar88 = vfmadd213ps_fma(auVar38,auVar97,auVar98);
        auVar100 = vfmadd213ps_avx512vl(auVar102,auVar97,auVar104);
        auVar101 = vfmadd213ps_avx512vl(auVar40,ZEXT1632(auVar150),ZEXT1632(auVar11));
        auVar90 = vfnmadd213ps_fma(auVar37,auVar97,auVar106);
        auVar111 = ZEXT1632(auVar150);
        auVar6 = vfmadd213ps_fma(auVar41,auVar111,ZEXT1632(auVar12));
        auVar92 = vfnmadd213ps_fma(auVar38,auVar97,auVar98);
        auVar8 = vfmadd213ps_fma(auVar99,auVar111,auVar103);
        auVar112 = vfnmadd231ps_avx512vl(auVar104,auVar97,auVar102);
        auVar11 = vfnmadd213ps_fma(auVar40,auVar111,ZEXT1632(auVar11));
        auVar12 = vfnmadd213ps_fma(auVar41,auVar111,ZEXT1632(auVar12));
        auVar93 = vfnmadd231ps_fma(auVar103,ZEXT1632(auVar150),auVar99);
        auVar99 = vsubps_avx512vl(auVar101,ZEXT1632(auVar90));
        auVar102 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar92));
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar8),auVar112);
        auVar104 = vmulps_avx512vl(auVar102,auVar112);
        auVar9 = vfmsub231ps_fma(auVar104,ZEXT1632(auVar92),auVar103);
        auVar42._4_4_ = auVar90._4_4_ * auVar103._4_4_;
        auVar42._0_4_ = auVar90._0_4_ * auVar103._0_4_;
        auVar42._8_4_ = auVar90._8_4_ * auVar103._8_4_;
        auVar42._12_4_ = auVar90._12_4_ * auVar103._12_4_;
        auVar42._16_4_ = auVar103._16_4_ * 0.0;
        auVar42._20_4_ = auVar103._20_4_ * 0.0;
        auVar42._24_4_ = auVar103._24_4_ * 0.0;
        auVar42._28_4_ = auVar103._28_4_;
        auVar103 = vfmsub231ps_avx512vl(auVar42,auVar112,auVar99);
        auVar43._4_4_ = auVar92._4_4_ * auVar99._4_4_;
        auVar43._0_4_ = auVar92._0_4_ * auVar99._0_4_;
        auVar43._8_4_ = auVar92._8_4_ * auVar99._8_4_;
        auVar43._12_4_ = auVar92._12_4_ * auVar99._12_4_;
        auVar43._16_4_ = auVar99._16_4_ * 0.0;
        auVar43._20_4_ = auVar99._20_4_ * 0.0;
        auVar43._24_4_ = auVar99._24_4_ * 0.0;
        auVar43._28_4_ = auVar99._28_4_;
        auVar10 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar90),auVar102);
        auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar107,auVar103);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,ZEXT1632(auVar9));
        auVar108 = ZEXT1632(auVar94);
        uVar76 = vcmpps_avx512vl(auVar102,auVar108,2);
        bVar75 = (byte)uVar76;
        fVar86 = (float)((uint)(bVar75 & 1) * auVar89._0_4_ |
                        (uint)!(bool)(bVar75 & 1) * auVar11._0_4_);
        bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
        fVar138 = (float)((uint)bVar21 * auVar89._4_4_ | (uint)!bVar21 * auVar11._4_4_);
        bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
        fVar140 = (float)((uint)bVar21 * auVar89._8_4_ | (uint)!bVar21 * auVar11._8_4_);
        bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
        fVar143 = (float)((uint)bVar21 * auVar89._12_4_ | (uint)!bVar21 * auVar11._12_4_);
        auVar104 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar140,CONCAT44(fVar138,fVar86))));
        fVar87 = (float)((uint)(bVar75 & 1) * auVar88._0_4_ |
                        (uint)!(bool)(bVar75 & 1) * auVar12._0_4_);
        bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
        fVar139 = (float)((uint)bVar21 * auVar88._4_4_ | (uint)!bVar21 * auVar12._4_4_);
        bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
        fVar141 = (float)((uint)bVar21 * auVar88._8_4_ | (uint)!bVar21 * auVar12._8_4_);
        bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
        fVar144 = (float)((uint)bVar21 * auVar88._12_4_ | (uint)!bVar21 * auVar12._12_4_);
        auVar111 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar141,CONCAT44(fVar139,fVar87))));
        auVar117._0_4_ =
             (float)((uint)(bVar75 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar93._0_4_
                    );
        bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar21 * auVar100._4_4_ | (uint)!bVar21 * auVar93._4_4_);
        bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar21 * auVar100._8_4_ | (uint)!bVar21 * auVar93._8_4_);
        bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar21 * auVar100._12_4_ | (uint)!bVar21 * auVar93._12_4_);
        fVar173 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar100._16_4_);
        auVar117._16_4_ = fVar173;
        fVar165 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar100._20_4_);
        auVar117._20_4_ = fVar165;
        fVar166 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar100._24_4_);
        auVar117._24_4_ = fVar166;
        iVar1 = (uint)(byte)(uVar76 >> 7) * auVar100._28_4_;
        auVar117._28_4_ = iVar1;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar90),auVar101);
        auVar118._0_4_ =
             (uint)(bVar75 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar9._0_4_;
        bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar21 * auVar99._4_4_ | (uint)!bVar21 * auVar9._4_4_;
        bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar21 * auVar99._8_4_ | (uint)!bVar21 * auVar9._8_4_;
        bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar21 * auVar99._12_4_ | (uint)!bVar21 * auVar9._12_4_;
        auVar118._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar99._16_4_;
        auVar118._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar99._20_4_;
        auVar118._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar99._24_4_;
        auVar118._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar99._28_4_;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar6));
        auVar119._0_4_ =
             (float)((uint)(bVar75 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar88._0_4_)
        ;
        bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar21 * auVar99._4_4_ | (uint)!bVar21 * auVar88._4_4_);
        bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar21 * auVar99._8_4_ | (uint)!bVar21 * auVar88._8_4_);
        bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar21 * auVar99._12_4_ | (uint)!bVar21 * auVar88._12_4_);
        fVar167 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar99._16_4_);
        auVar119._16_4_ = fVar167;
        fVar172 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar99._20_4_);
        auVar119._20_4_ = fVar172;
        fVar180 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar99._24_4_);
        auVar119._24_4_ = fVar180;
        auVar119._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar99._28_4_;
        auVar99 = vblendmps_avx512vl(auVar112,ZEXT1632(auVar8));
        auVar120._0_4_ =
             (float)((uint)(bVar75 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar100._0_4_
                    );
        bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar21 * auVar99._4_4_ | (uint)!bVar21 * auVar100._4_4_);
        bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar21 * auVar99._8_4_ | (uint)!bVar21 * auVar100._8_4_);
        bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar21 * auVar99._12_4_ | (uint)!bVar21 * auVar100._12_4_);
        bVar21 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar21 * auVar99._16_4_ | (uint)!bVar21 * auVar100._16_4_);
        bVar21 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar21 * auVar99._20_4_ | (uint)!bVar21 * auVar100._20_4_);
        bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar21 * auVar99._24_4_ | (uint)!bVar21 * auVar100._24_4_);
        bVar21 = SUB81(uVar76 >> 7,0);
        auVar120._28_4_ = (uint)bVar21 * auVar99._28_4_ | (uint)!bVar21 * auVar100._28_4_;
        auVar121._0_4_ =
             (uint)(bVar75 & 1) * (int)auVar90._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar101._0_4_;
        bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar21 * (int)auVar90._4_4_ | (uint)!bVar21 * auVar101._4_4_;
        bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar21 * (int)auVar90._8_4_ | (uint)!bVar21 * auVar101._8_4_;
        bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar21 * (int)auVar90._12_4_ | (uint)!bVar21 * auVar101._12_4_;
        auVar121._16_4_ = (uint)!(bool)((byte)(uVar76 >> 4) & 1) * auVar101._16_4_;
        auVar121._20_4_ = (uint)!(bool)((byte)(uVar76 >> 5) & 1) * auVar101._20_4_;
        auVar121._24_4_ = (uint)!(bool)((byte)(uVar76 >> 6) & 1) * auVar101._24_4_;
        auVar121._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar101._28_4_;
        bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
        bVar23 = (bool)((byte)(uVar76 >> 2) & 1);
        bVar24 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar122._0_4_ =
             (uint)(bVar75 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar8._0_4_;
        bVar22 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar22 * auVar112._4_4_ | (uint)!bVar22 * auVar8._4_4_;
        bVar22 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar22 * auVar112._8_4_ | (uint)!bVar22 * auVar8._8_4_;
        bVar22 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar22 * auVar112._12_4_ | (uint)!bVar22 * auVar8._12_4_;
        auVar122._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar112._16_4_;
        auVar122._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar112._20_4_;
        auVar122._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar112._24_4_;
        iVar2 = (uint)(byte)(uVar76 >> 7) * auVar112._28_4_;
        auVar122._28_4_ = iVar2;
        auVar106 = vsubps_avx512vl(auVar121,auVar104);
        auVar99 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar24 * (int)auVar92._12_4_ |
                                                (uint)!bVar24 * auVar6._12_4_,
                                                CONCAT48((uint)bVar23 * (int)auVar92._8_4_ |
                                                         (uint)!bVar23 * auVar6._8_4_,
                                                         CONCAT44((uint)bVar21 * (int)auVar92._4_4_
                                                                  | (uint)!bVar21 * auVar6._4_4_,
                                                                  (uint)(bVar75 & 1) *
                                                                  (int)auVar92._0_4_ |
                                                                  (uint)!(bool)(bVar75 & 1) *
                                                                  auVar6._0_4_)))),auVar111);
        auVar203 = ZEXT3264(auVar99);
        auVar100 = vsubps_avx(auVar122,auVar117);
        auVar101 = vsubps_avx(auVar104,auVar118);
        auVar206 = ZEXT3264(auVar101);
        auVar112 = vsubps_avx(auVar111,auVar119);
        auVar103 = vsubps_avx(auVar117,auVar120);
        auVar44._4_4_ = auVar100._4_4_ * fVar138;
        auVar44._0_4_ = auVar100._0_4_ * fVar86;
        auVar44._8_4_ = auVar100._8_4_ * fVar140;
        auVar44._12_4_ = auVar100._12_4_ * fVar143;
        auVar44._16_4_ = auVar100._16_4_ * 0.0;
        auVar44._20_4_ = auVar100._20_4_ * 0.0;
        auVar44._24_4_ = auVar100._24_4_ * 0.0;
        auVar44._28_4_ = iVar2;
        auVar89 = vfmsub231ps_fma(auVar44,auVar117,auVar106);
        auVar45._4_4_ = fVar139 * auVar106._4_4_;
        auVar45._0_4_ = fVar87 * auVar106._0_4_;
        auVar45._8_4_ = fVar141 * auVar106._8_4_;
        auVar45._12_4_ = fVar144 * auVar106._12_4_;
        auVar45._16_4_ = auVar106._16_4_ * 0.0;
        auVar45._20_4_ = auVar106._20_4_ * 0.0;
        auVar45._24_4_ = auVar106._24_4_ * 0.0;
        auVar45._28_4_ = auVar102._28_4_;
        auVar88 = vfmsub231ps_fma(auVar45,auVar104,auVar99);
        auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar108,ZEXT1632(auVar89));
        auVar187._0_4_ = auVar99._0_4_ * auVar117._0_4_;
        auVar187._4_4_ = auVar99._4_4_ * auVar117._4_4_;
        auVar187._8_4_ = auVar99._8_4_ * auVar117._8_4_;
        auVar187._12_4_ = auVar99._12_4_ * auVar117._12_4_;
        auVar187._16_4_ = auVar99._16_4_ * fVar173;
        auVar187._20_4_ = auVar99._20_4_ * fVar165;
        auVar187._24_4_ = auVar99._24_4_ * fVar166;
        auVar187._28_4_ = 0;
        auVar89 = vfmsub231ps_fma(auVar187,auVar111,auVar100);
        auVar98 = vfmadd231ps_avx512vl(auVar102,auVar108,ZEXT1632(auVar89));
        auVar102 = vmulps_avx512vl(auVar103,auVar118);
        auVar102 = vfmsub231ps_avx512vl(auVar102,auVar101,auVar120);
        auVar46._4_4_ = auVar112._4_4_ * auVar120._4_4_;
        auVar46._0_4_ = auVar112._0_4_ * auVar120._0_4_;
        auVar46._8_4_ = auVar112._8_4_ * auVar120._8_4_;
        auVar46._12_4_ = auVar112._12_4_ * auVar120._12_4_;
        auVar46._16_4_ = auVar112._16_4_ * auVar120._16_4_;
        auVar46._20_4_ = auVar112._20_4_ * auVar120._20_4_;
        auVar46._24_4_ = auVar112._24_4_ * auVar120._24_4_;
        auVar46._28_4_ = auVar120._28_4_;
        auVar89 = vfmsub231ps_fma(auVar46,auVar119,auVar103);
        auVar188._0_4_ = auVar119._0_4_ * auVar101._0_4_;
        auVar188._4_4_ = auVar119._4_4_ * auVar101._4_4_;
        auVar188._8_4_ = auVar119._8_4_ * auVar101._8_4_;
        auVar188._12_4_ = auVar119._12_4_ * auVar101._12_4_;
        auVar188._16_4_ = fVar167 * auVar101._16_4_;
        auVar188._20_4_ = fVar172 * auVar101._20_4_;
        auVar188._24_4_ = fVar180 * auVar101._24_4_;
        auVar188._28_4_ = 0;
        auVar88 = vfmsub231ps_fma(auVar188,auVar112,auVar118);
        auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar108,auVar102);
        auVar107 = vfmadd231ps_avx512vl(auVar102,auVar108,ZEXT1632(auVar89));
        auVar193 = ZEXT3264(auVar107);
        auVar102 = vmaxps_avx(auVar98,auVar107);
        uVar168 = vcmpps_avx512vl(auVar102,auVar108,2);
        bVar84 = bVar84 & (byte)uVar168;
        if (bVar84 != 0) {
          uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar222._4_4_ = uVar149;
          auVar222._0_4_ = uVar149;
          auVar222._8_4_ = uVar149;
          auVar222._12_4_ = uVar149;
          auVar222._16_4_ = uVar149;
          auVar222._20_4_ = uVar149;
          auVar222._24_4_ = uVar149;
          auVar222._28_4_ = uVar149;
          auVar225 = ZEXT3264(auVar222);
          auVar47._4_4_ = auVar103._4_4_ * auVar99._4_4_;
          auVar47._0_4_ = auVar103._0_4_ * auVar99._0_4_;
          auVar47._8_4_ = auVar103._8_4_ * auVar99._8_4_;
          auVar47._12_4_ = auVar103._12_4_ * auVar99._12_4_;
          auVar47._16_4_ = auVar103._16_4_ * auVar99._16_4_;
          auVar47._20_4_ = auVar103._20_4_ * auVar99._20_4_;
          auVar47._24_4_ = auVar103._24_4_ * auVar99._24_4_;
          auVar47._28_4_ = auVar102._28_4_;
          auVar8 = vfmsub231ps_fma(auVar47,auVar112,auVar100);
          auVar48._4_4_ = auVar100._4_4_ * auVar101._4_4_;
          auVar48._0_4_ = auVar100._0_4_ * auVar101._0_4_;
          auVar48._8_4_ = auVar100._8_4_ * auVar101._8_4_;
          auVar48._12_4_ = auVar100._12_4_ * auVar101._12_4_;
          auVar48._16_4_ = auVar100._16_4_ * auVar101._16_4_;
          auVar48._20_4_ = auVar100._20_4_ * auVar101._20_4_;
          auVar48._24_4_ = auVar100._24_4_ * auVar101._24_4_;
          auVar48._28_4_ = auVar100._28_4_;
          auVar6 = vfmsub231ps_fma(auVar48,auVar106,auVar103);
          auVar49._4_4_ = auVar112._4_4_ * auVar106._4_4_;
          auVar49._0_4_ = auVar112._0_4_ * auVar106._0_4_;
          auVar49._8_4_ = auVar112._8_4_ * auVar106._8_4_;
          auVar49._12_4_ = auVar112._12_4_ * auVar106._12_4_;
          auVar49._16_4_ = auVar112._16_4_ * auVar106._16_4_;
          auVar49._20_4_ = auVar112._20_4_ * auVar106._20_4_;
          auVar49._24_4_ = auVar112._24_4_ * auVar106._24_4_;
          auVar49._28_4_ = auVar112._28_4_;
          auVar9 = vfmsub231ps_fma(auVar49,auVar101,auVar99);
          auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar9));
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar8),ZEXT1232(ZEXT412(0)) << 0x20)
          ;
          auVar102 = vrcp14ps_avx512vl(ZEXT1632(auVar88));
          auVar99 = vfnmadd213ps_avx512vl(auVar102,ZEXT1632(auVar88),auVar105);
          auVar89 = vfmadd132ps_fma(auVar99,auVar102,auVar102);
          auVar203 = ZEXT1664(auVar89);
          auVar50._4_4_ = auVar9._4_4_ * auVar117._4_4_;
          auVar50._0_4_ = auVar9._0_4_ * auVar117._0_4_;
          auVar50._8_4_ = auVar9._8_4_ * auVar117._8_4_;
          auVar50._12_4_ = auVar9._12_4_ * auVar117._12_4_;
          auVar50._16_4_ = fVar173 * 0.0;
          auVar50._20_4_ = fVar165 * 0.0;
          auVar50._24_4_ = fVar166 * 0.0;
          auVar50._28_4_ = iVar1;
          auVar6 = vfmadd231ps_fma(auVar50,auVar111,ZEXT1632(auVar6));
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar104,ZEXT1632(auVar8));
          fVar173 = auVar89._0_4_;
          fVar165 = auVar89._4_4_;
          fVar166 = auVar89._8_4_;
          fVar167 = auVar89._12_4_;
          local_3e0._28_4_ = auVar102._28_4_;
          local_3e0._0_28_ =
               ZEXT1628(CONCAT412(auVar6._12_4_ * fVar167,
                                  CONCAT48(auVar6._8_4_ * fVar166,
                                           CONCAT44(auVar6._4_4_ * fVar165,auVar6._0_4_ * fVar173)))
                       );
          auVar206 = ZEXT3264(local_3e0);
          auVar156._4_4_ = local_560;
          auVar156._0_4_ = local_560;
          auVar156._8_4_ = local_560;
          auVar156._12_4_ = local_560;
          auVar156._16_4_ = local_560;
          auVar156._20_4_ = local_560;
          auVar156._24_4_ = local_560;
          auVar156._28_4_ = local_560;
          uVar168 = vcmpps_avx512vl(local_3e0,auVar222,2);
          uVar29 = vcmpps_avx512vl(auVar156,local_3e0,2);
          bVar84 = (byte)uVar168 & (byte)uVar29 & bVar84;
          if (bVar84 != 0) {
            uVar85 = vcmpps_avx512vl(ZEXT1632(auVar88),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar85 = bVar84 & uVar85;
            if ((char)uVar85 != '\0') {
              fVar172 = auVar98._0_4_ * fVar173;
              fVar180 = auVar98._4_4_ * fVar165;
              auVar51._4_4_ = fVar180;
              auVar51._0_4_ = fVar172;
              fVar86 = auVar98._8_4_ * fVar166;
              auVar51._8_4_ = fVar86;
              fVar87 = auVar98._12_4_ * fVar167;
              auVar51._12_4_ = fVar87;
              fVar138 = auVar98._16_4_ * 0.0;
              auVar51._16_4_ = fVar138;
              fVar139 = auVar98._20_4_ * 0.0;
              auVar51._20_4_ = fVar139;
              fVar140 = auVar98._24_4_ * 0.0;
              auVar51._24_4_ = fVar140;
              auVar51._28_4_ = auVar98._28_4_;
              auVar102 = vsubps_avx512vl(auVar105,auVar51);
              local_420._0_4_ =
                   (float)((uint)(bVar75 & 1) * (int)fVar172 |
                          (uint)!(bool)(bVar75 & 1) * auVar102._0_4_);
              bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
              local_420._4_4_ =
                   (float)((uint)bVar21 * (int)fVar180 | (uint)!bVar21 * auVar102._4_4_);
              bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
              local_420._8_4_ = (float)((uint)bVar21 * (int)fVar86 | (uint)!bVar21 * auVar102._8_4_)
              ;
              bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
              local_420._12_4_ =
                   (float)((uint)bVar21 * (int)fVar87 | (uint)!bVar21 * auVar102._12_4_);
              bVar21 = (bool)((byte)(uVar76 >> 4) & 1);
              local_420._16_4_ =
                   (float)((uint)bVar21 * (int)fVar138 | (uint)!bVar21 * auVar102._16_4_);
              bVar21 = (bool)((byte)(uVar76 >> 5) & 1);
              local_420._20_4_ =
                   (float)((uint)bVar21 * (int)fVar139 | (uint)!bVar21 * auVar102._20_4_);
              bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
              local_420._24_4_ =
                   (float)((uint)bVar21 * (int)fVar140 | (uint)!bVar21 * auVar102._24_4_);
              bVar21 = SUB81(uVar76 >> 7,0);
              local_420._28_4_ =
                   (float)((uint)bVar21 * auVar98._28_4_ | (uint)!bVar21 * auVar102._28_4_);
              auVar102 = vsubps_avx(ZEXT1632(auVar150),auVar97);
              auVar89 = vfmadd213ps_fma(auVar102,local_420,auVar97);
              uVar149 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar31._4_4_ = uVar149;
              auVar31._0_4_ = uVar149;
              auVar31._8_4_ = uVar149;
              auVar31._12_4_ = uVar149;
              auVar31._16_4_ = uVar149;
              auVar31._20_4_ = uVar149;
              auVar31._24_4_ = uVar149;
              auVar31._28_4_ = uVar149;
              auVar102 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                            CONCAT48(auVar89._8_4_ + auVar89._8_4_,
                                                                     CONCAT44(auVar89._4_4_ +
                                                                              auVar89._4_4_,
                                                                              auVar89._0_4_ +
                                                                              auVar89._0_4_)))),
                                         auVar31);
              uVar28 = vcmpps_avx512vl(local_3e0,auVar102,6);
              uVar85 = uVar85 & uVar28;
              bVar84 = (byte)uVar85;
              if (bVar84 != 0) {
                auVar179._0_4_ = auVar107._0_4_ * fVar173;
                auVar179._4_4_ = auVar107._4_4_ * fVar165;
                auVar179._8_4_ = auVar107._8_4_ * fVar166;
                auVar179._12_4_ = auVar107._12_4_ * fVar167;
                auVar179._16_4_ = auVar107._16_4_ * 0.0;
                auVar179._20_4_ = auVar107._20_4_ * 0.0;
                auVar179._24_4_ = auVar107._24_4_ * 0.0;
                auVar179._28_4_ = 0;
                auVar102 = vsubps_avx512vl(auVar105,auVar179);
                auVar123._0_4_ =
                     (uint)(bVar75 & 1) * (int)auVar179._0_4_ |
                     (uint)!(bool)(bVar75 & 1) * auVar102._0_4_;
                bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
                auVar123._4_4_ = (uint)bVar21 * (int)auVar179._4_4_ | (uint)!bVar21 * auVar102._4_4_
                ;
                bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
                auVar123._8_4_ = (uint)bVar21 * (int)auVar179._8_4_ | (uint)!bVar21 * auVar102._8_4_
                ;
                bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
                auVar123._12_4_ =
                     (uint)bVar21 * (int)auVar179._12_4_ | (uint)!bVar21 * auVar102._12_4_;
                bVar21 = (bool)((byte)(uVar76 >> 4) & 1);
                auVar123._16_4_ =
                     (uint)bVar21 * (int)auVar179._16_4_ | (uint)!bVar21 * auVar102._16_4_;
                bVar21 = (bool)((byte)(uVar76 >> 5) & 1);
                auVar123._20_4_ =
                     (uint)bVar21 * (int)auVar179._20_4_ | (uint)!bVar21 * auVar102._20_4_;
                bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
                auVar123._24_4_ =
                     (uint)bVar21 * (int)auVar179._24_4_ | (uint)!bVar21 * auVar102._24_4_;
                auVar123._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar102._28_4_;
                auVar32._8_4_ = 0x40000000;
                auVar32._0_8_ = 0x4000000040000000;
                auVar32._12_4_ = 0x40000000;
                auVar32._16_4_ = 0x40000000;
                auVar32._20_4_ = 0x40000000;
                auVar32._24_4_ = 0x40000000;
                auVar32._28_4_ = 0x40000000;
                local_400 = vfmsub132ps_avx512vl(auVar123,auVar105,auVar32);
                local_3c0 = 0;
                local_3b0 = local_690;
                uStack_3a8 = uStack_688;
                local_3a0 = local_6b0;
                uStack_398 = uStack_6a8;
                local_390 = local_6c0;
                uStack_388 = uStack_6b8;
                local_380 = local_6a0;
                uStack_378 = uStack_698;
                if ((pGVar81->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar173 = 1.0 / auVar209._0_4_;
                  local_360[0] = fVar173 * (local_420._0_4_ + 0.0);
                  local_360[1] = fVar173 * (local_420._4_4_ + 1.0);
                  local_360[2] = fVar173 * (local_420._8_4_ + 2.0);
                  local_360[3] = fVar173 * (local_420._12_4_ + 3.0);
                  fStack_350 = fVar173 * (local_420._16_4_ + 4.0);
                  fStack_34c = fVar173 * (local_420._20_4_ + 5.0);
                  fStack_348 = fVar173 * (local_420._24_4_ + 6.0);
                  fStack_344 = local_420._28_4_ + 7.0;
                  local_340 = local_400;
                  local_320 = local_3e0;
                  auVar157._8_4_ = 0x7f800000;
                  auVar157._0_8_ = 0x7f8000007f800000;
                  auVar157._12_4_ = 0x7f800000;
                  auVar157._16_4_ = 0x7f800000;
                  auVar157._20_4_ = 0x7f800000;
                  auVar157._24_4_ = 0x7f800000;
                  auVar157._28_4_ = 0x7f800000;
                  auVar102 = vblendmps_avx512vl(auVar157,local_3e0);
                  auVar124._0_4_ =
                       (uint)(bVar84 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar84 & 1) * 0x7f800000;
                  bVar21 = (bool)((byte)(uVar85 >> 1) & 1);
                  auVar124._4_4_ = (uint)bVar21 * auVar102._4_4_ | (uint)!bVar21 * 0x7f800000;
                  bVar21 = (bool)((byte)(uVar85 >> 2) & 1);
                  auVar124._8_4_ = (uint)bVar21 * auVar102._8_4_ | (uint)!bVar21 * 0x7f800000;
                  bVar21 = (bool)((byte)(uVar85 >> 3) & 1);
                  auVar124._12_4_ = (uint)bVar21 * auVar102._12_4_ | (uint)!bVar21 * 0x7f800000;
                  bVar21 = (bool)((byte)(uVar85 >> 4) & 1);
                  auVar124._16_4_ = (uint)bVar21 * auVar102._16_4_ | (uint)!bVar21 * 0x7f800000;
                  bVar21 = (bool)((byte)(uVar85 >> 5) & 1);
                  auVar124._20_4_ = (uint)bVar21 * auVar102._20_4_ | (uint)!bVar21 * 0x7f800000;
                  bVar21 = (bool)((byte)(uVar85 >> 6) & 1);
                  auVar124._24_4_ = (uint)bVar21 * auVar102._24_4_ | (uint)!bVar21 * 0x7f800000;
                  bVar21 = SUB81(uVar85 >> 7,0);
                  auVar124._28_4_ = (uint)bVar21 * auVar102._28_4_ | (uint)!bVar21 * 0x7f800000;
                  auVar102 = vshufps_avx(auVar124,auVar124,0xb1);
                  auVar102 = vminps_avx(auVar124,auVar102);
                  auVar99 = vshufpd_avx(auVar102,auVar102,5);
                  auVar102 = vminps_avx(auVar102,auVar99);
                  auVar99 = vpermpd_avx2(auVar102,0x4e);
                  auVar102 = vminps_avx(auVar102,auVar99);
                  uVar168 = vcmpps_avx512vl(auVar124,auVar102,0);
                  uVar77 = (uint)uVar85;
                  if (((byte)uVar168 & bVar84) != 0) {
                    uVar77 = (uint)((byte)uVar168 & bVar84);
                  }
                  uVar78 = 0;
                  for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                    uVar78 = uVar78 + 1;
                  }
                  uVar76 = (ulong)uVar78;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar81->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_540 = vpbroadcastd_avx512vl();
                    local_5c0 = vpbroadcastd_avx512vl();
                    local_600 = local_3e0;
                    local_3bc = iVar15;
                    do {
                      local_200 = local_360[uVar76];
                      local_1e0 = *(undefined4 *)(local_340 + uVar76 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar76 * 4)
                      ;
                      local_678.context = context->user;
                      fVar165 = 1.0 - local_200;
                      fVar173 = fVar165 * fVar165 * -3.0;
                      auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165)),
                                                ZEXT416((uint)(local_200 * fVar165)),
                                                ZEXT416(0xc0000000));
                      auVar88 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar165)),
                                                ZEXT416((uint)(local_200 * local_200)),
                                                ZEXT416(0x40000000));
                      fVar165 = auVar89._0_4_ * 3.0;
                      fVar166 = auVar88._0_4_ * 3.0;
                      fVar167 = local_200 * local_200 * 3.0;
                      auVar198._0_4_ = fVar167 * fVar147;
                      auVar198._4_4_ = fVar167 * fVar148;
                      auVar198._8_4_ = fVar167 * fVar163;
                      auVar198._12_4_ = fVar167 * fVar164;
                      auVar153._4_4_ = fVar166;
                      auVar153._0_4_ = fVar166;
                      auVar153._8_4_ = fVar166;
                      auVar153._12_4_ = fVar166;
                      auVar89 = vfmadd132ps_fma(auVar153,auVar198,auVar91);
                      auVar185._4_4_ = fVar165;
                      auVar185._0_4_ = fVar165;
                      auVar185._8_4_ = fVar165;
                      auVar185._12_4_ = fVar165;
                      auVar89 = vfmadd132ps_fma(auVar185,auVar89,auVar169);
                      auVar154._4_4_ = fVar173;
                      auVar154._0_4_ = fVar173;
                      auVar154._8_4_ = fVar173;
                      auVar154._12_4_ = fVar173;
                      auVar89 = vfmadd132ps_fma(auVar154,auVar89,auVar7);
                      local_260 = auVar89._0_4_;
                      auVar192._8_4_ = 1;
                      auVar192._0_8_ = 0x100000001;
                      auVar192._12_4_ = 1;
                      auVar192._16_4_ = 1;
                      auVar192._20_4_ = 1;
                      auVar192._24_4_ = 1;
                      auVar192._28_4_ = 1;
                      local_240 = vpermps_avx2(auVar192,ZEXT1632(auVar89));
                      auVar193 = ZEXT3264(local_240);
                      auVar199._8_4_ = 2;
                      auVar199._0_8_ = 0x200000002;
                      auVar199._12_4_ = 2;
                      auVar202._16_4_ = 2;
                      auVar202._0_16_ = auVar199;
                      auVar202._20_4_ = 2;
                      auVar202._24_4_ = 2;
                      auVar202._28_4_ = 2;
                      auVar203 = ZEXT3264(auVar202);
                      local_220 = vpermps_avx2(auVar202,ZEXT1632(auVar89));
                      iStack_25c = local_260;
                      iStack_258 = local_260;
                      iStack_254 = local_260;
                      iStack_250 = local_260;
                      iStack_24c = local_260;
                      iStack_248 = local_260;
                      iStack_244 = local_260;
                      fStack_1fc = local_200;
                      fStack_1f8 = local_200;
                      fStack_1f4 = local_200;
                      fStack_1f0 = local_200;
                      fStack_1ec = local_200;
                      fStack_1e8 = local_200;
                      fStack_1e4 = local_200;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = local_5c0._0_8_;
                      uStack_1b8 = local_5c0._8_8_;
                      uStack_1b0 = local_5c0._16_8_;
                      uStack_1a8 = local_5c0._24_8_;
                      local_1a0 = local_540;
                      auVar102 = vpcmpeqd_avx2(local_540,local_540);
                      local_648[1] = auVar102;
                      *local_648 = auVar102;
                      local_180 = (local_678.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_678.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_640 = local_300;
                      local_678.valid = (int *)local_640;
                      local_678.geometryUserPtr = pGVar81->userPtr;
                      local_678.hit = (RTCHitN *)&local_260;
                      local_678.N = 8;
                      local_5a0 = auVar225._0_32_;
                      local_678.ray = (RTCRayN *)ray;
                      if (pGVar81->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar193 = ZEXT1664(local_240._0_16_);
                        auVar203 = ZEXT1664(auVar199);
                        (*pGVar81->intersectionFilterN)(&local_678);
                        auVar206 = ZEXT3264(local_600);
                        auVar225 = ZEXT3264(local_5a0);
                        auVar228 = ZEXT464(0xbf800000);
                        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar227 = ZEXT3264(auVar102);
                      }
                      if (local_640 == (undefined1  [32])0x0) {
LAB_01e4b8f9:
                        *(int *)(ray + k * 4 + 0x100) = auVar225._0_4_;
                      }
                      else {
                        p_Var20 = context->args->filter;
                        if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar81->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar193 = ZEXT1664(auVar193._0_16_);
                          auVar203 = ZEXT1664(auVar203._0_16_);
                          (*p_Var20)(&local_678);
                          auVar206 = ZEXT3264(local_600);
                          auVar225 = ZEXT3264(local_5a0);
                          auVar228 = ZEXT464(0xbf800000);
                          auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar227 = ZEXT3264(auVar102);
                        }
                        if (local_640 == (undefined1  [32])0x0) goto LAB_01e4b8f9;
                        uVar28 = vptestmd_avx512vl(local_640,local_640);
                        iVar1 = *(int *)(local_678.hit + 4);
                        iVar2 = *(int *)(local_678.hit + 8);
                        iVar69 = *(int *)(local_678.hit + 0xc);
                        iVar70 = *(int *)(local_678.hit + 0x10);
                        iVar71 = *(int *)(local_678.hit + 0x14);
                        iVar72 = *(int *)(local_678.hit + 0x18);
                        iVar73 = *(int *)(local_678.hit + 0x1c);
                        bVar84 = (byte)uVar28;
                        bVar21 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar22 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar23 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar24 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar25 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar26 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar27 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_678.ray + 0x180) =
                             (uint)(bVar84 & 1) * *(int *)local_678.hit |
                             (uint)!(bool)(bVar84 & 1) * *(int *)(local_678.ray + 0x180);
                        *(uint *)(local_678.ray + 0x184) =
                             (uint)bVar21 * iVar1 | (uint)!bVar21 * *(int *)(local_678.ray + 0x184);
                        *(uint *)(local_678.ray + 0x188) =
                             (uint)bVar22 * iVar2 | (uint)!bVar22 * *(int *)(local_678.ray + 0x188);
                        *(uint *)(local_678.ray + 0x18c) =
                             (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_678.ray + 0x18c)
                        ;
                        *(uint *)(local_678.ray + 400) =
                             (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_678.ray + 400);
                        *(uint *)(local_678.ray + 0x194) =
                             (uint)bVar25 * iVar71 | (uint)!bVar25 * *(int *)(local_678.ray + 0x194)
                        ;
                        *(uint *)(local_678.ray + 0x198) =
                             (uint)bVar26 * iVar72 | (uint)!bVar26 * *(int *)(local_678.ray + 0x198)
                        ;
                        *(uint *)(local_678.ray + 0x19c) =
                             (uint)bVar27 * iVar73 | (uint)!bVar27 * *(int *)(local_678.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_678.hit + 0x24);
                        iVar2 = *(int *)(local_678.hit + 0x28);
                        iVar69 = *(int *)(local_678.hit + 0x2c);
                        iVar70 = *(int *)(local_678.hit + 0x30);
                        iVar71 = *(int *)(local_678.hit + 0x34);
                        iVar72 = *(int *)(local_678.hit + 0x38);
                        iVar73 = *(int *)(local_678.hit + 0x3c);
                        bVar21 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar22 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar23 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar24 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar25 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar26 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar27 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_678.ray + 0x1a0) =
                             (uint)(bVar84 & 1) * *(int *)(local_678.hit + 0x20) |
                             (uint)!(bool)(bVar84 & 1) * *(int *)(local_678.ray + 0x1a0);
                        *(uint *)(local_678.ray + 0x1a4) =
                             (uint)bVar21 * iVar1 | (uint)!bVar21 * *(int *)(local_678.ray + 0x1a4);
                        *(uint *)(local_678.ray + 0x1a8) =
                             (uint)bVar22 * iVar2 | (uint)!bVar22 * *(int *)(local_678.ray + 0x1a8);
                        *(uint *)(local_678.ray + 0x1ac) =
                             (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_678.ray + 0x1ac)
                        ;
                        *(uint *)(local_678.ray + 0x1b0) =
                             (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_678.ray + 0x1b0)
                        ;
                        *(uint *)(local_678.ray + 0x1b4) =
                             (uint)bVar25 * iVar71 | (uint)!bVar25 * *(int *)(local_678.ray + 0x1b4)
                        ;
                        *(uint *)(local_678.ray + 0x1b8) =
                             (uint)bVar26 * iVar72 | (uint)!bVar26 * *(int *)(local_678.ray + 0x1b8)
                        ;
                        *(uint *)(local_678.ray + 0x1bc) =
                             (uint)bVar27 * iVar73 | (uint)!bVar27 * *(int *)(local_678.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_678.hit + 0x44);
                        iVar2 = *(int *)(local_678.hit + 0x48);
                        iVar69 = *(int *)(local_678.hit + 0x4c);
                        iVar70 = *(int *)(local_678.hit + 0x50);
                        iVar71 = *(int *)(local_678.hit + 0x54);
                        iVar72 = *(int *)(local_678.hit + 0x58);
                        iVar73 = *(int *)(local_678.hit + 0x5c);
                        bVar21 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar22 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar23 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar24 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar25 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar26 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar27 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_678.ray + 0x1c0) =
                             (uint)(bVar84 & 1) * *(int *)(local_678.hit + 0x40) |
                             (uint)!(bool)(bVar84 & 1) * *(int *)(local_678.ray + 0x1c0);
                        *(uint *)(local_678.ray + 0x1c4) =
                             (uint)bVar21 * iVar1 | (uint)!bVar21 * *(int *)(local_678.ray + 0x1c4);
                        *(uint *)(local_678.ray + 0x1c8) =
                             (uint)bVar22 * iVar2 | (uint)!bVar22 * *(int *)(local_678.ray + 0x1c8);
                        *(uint *)(local_678.ray + 0x1cc) =
                             (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_678.ray + 0x1cc)
                        ;
                        *(uint *)(local_678.ray + 0x1d0) =
                             (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_678.ray + 0x1d0)
                        ;
                        *(uint *)(local_678.ray + 0x1d4) =
                             (uint)bVar25 * iVar71 | (uint)!bVar25 * *(int *)(local_678.ray + 0x1d4)
                        ;
                        *(uint *)(local_678.ray + 0x1d8) =
                             (uint)bVar26 * iVar72 | (uint)!bVar26 * *(int *)(local_678.ray + 0x1d8)
                        ;
                        *(uint *)(local_678.ray + 0x1dc) =
                             (uint)bVar27 * iVar73 | (uint)!bVar27 * *(int *)(local_678.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_678.hit + 100);
                        iVar2 = *(int *)(local_678.hit + 0x68);
                        iVar69 = *(int *)(local_678.hit + 0x6c);
                        iVar70 = *(int *)(local_678.hit + 0x70);
                        iVar71 = *(int *)(local_678.hit + 0x74);
                        iVar72 = *(int *)(local_678.hit + 0x78);
                        iVar73 = *(int *)(local_678.hit + 0x7c);
                        bVar21 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar22 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar23 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar24 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar25 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar26 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar27 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_678.ray + 0x1e0) =
                             (uint)(bVar84 & 1) * *(int *)(local_678.hit + 0x60) |
                             (uint)!(bool)(bVar84 & 1) * *(int *)(local_678.ray + 0x1e0);
                        *(uint *)(local_678.ray + 0x1e4) =
                             (uint)bVar21 * iVar1 | (uint)!bVar21 * *(int *)(local_678.ray + 0x1e4);
                        *(uint *)(local_678.ray + 0x1e8) =
                             (uint)bVar22 * iVar2 | (uint)!bVar22 * *(int *)(local_678.ray + 0x1e8);
                        *(uint *)(local_678.ray + 0x1ec) =
                             (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_678.ray + 0x1ec)
                        ;
                        *(uint *)(local_678.ray + 0x1f0) =
                             (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_678.ray + 0x1f0)
                        ;
                        *(uint *)(local_678.ray + 500) =
                             (uint)bVar25 * iVar71 | (uint)!bVar25 * *(int *)(local_678.ray + 500);
                        *(uint *)(local_678.ray + 0x1f8) =
                             (uint)bVar26 * iVar72 | (uint)!bVar26 * *(int *)(local_678.ray + 0x1f8)
                        ;
                        *(uint *)(local_678.ray + 0x1fc) =
                             (uint)bVar27 * iVar73 | (uint)!bVar27 * *(int *)(local_678.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_678.hit + 0x84);
                        iVar2 = *(int *)(local_678.hit + 0x88);
                        iVar69 = *(int *)(local_678.hit + 0x8c);
                        iVar70 = *(int *)(local_678.hit + 0x90);
                        iVar71 = *(int *)(local_678.hit + 0x94);
                        iVar72 = *(int *)(local_678.hit + 0x98);
                        iVar73 = *(int *)(local_678.hit + 0x9c);
                        bVar21 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar22 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar23 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar24 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar25 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar26 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar27 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_678.ray + 0x200) =
                             (uint)(bVar84 & 1) * *(int *)(local_678.hit + 0x80) |
                             (uint)!(bool)(bVar84 & 1) * *(int *)(local_678.ray + 0x200);
                        *(uint *)(local_678.ray + 0x204) =
                             (uint)bVar21 * iVar1 | (uint)!bVar21 * *(int *)(local_678.ray + 0x204);
                        *(uint *)(local_678.ray + 0x208) =
                             (uint)bVar22 * iVar2 | (uint)!bVar22 * *(int *)(local_678.ray + 0x208);
                        *(uint *)(local_678.ray + 0x20c) =
                             (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_678.ray + 0x20c)
                        ;
                        *(uint *)(local_678.ray + 0x210) =
                             (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_678.ray + 0x210)
                        ;
                        *(uint *)(local_678.ray + 0x214) =
                             (uint)bVar25 * iVar71 | (uint)!bVar25 * *(int *)(local_678.ray + 0x214)
                        ;
                        *(uint *)(local_678.ray + 0x218) =
                             (uint)bVar26 * iVar72 | (uint)!bVar26 * *(int *)(local_678.ray + 0x218)
                        ;
                        *(uint *)(local_678.ray + 0x21c) =
                             (uint)bVar27 * iVar73 | (uint)!bVar27 * *(int *)(local_678.ray + 0x21c)
                        ;
                        auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xa0));
                        *(undefined1 (*) [32])(local_678.ray + 0x220) = auVar102;
                        auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xc0));
                        *(undefined1 (*) [32])(local_678.ray + 0x240) = auVar102;
                        auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xe0));
                        *(undefined1 (*) [32])(local_678.ray + 0x260) = auVar102;
                        auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_678.ray + 0x280) = auVar102;
                        auVar225 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                      }
                      bVar84 = ~(byte)(1 << ((uint)uVar76 & 0x1f)) & (byte)uVar85;
                      uVar149 = auVar225._0_4_;
                      auVar161._4_4_ = uVar149;
                      auVar161._0_4_ = uVar149;
                      auVar161._8_4_ = uVar149;
                      auVar161._12_4_ = uVar149;
                      auVar161._16_4_ = uVar149;
                      auVar161._20_4_ = uVar149;
                      auVar161._24_4_ = uVar149;
                      auVar161._28_4_ = uVar149;
                      uVar168 = vcmpps_avx512vl(auVar206._0_32_,auVar161,2);
                      if ((bVar84 & (byte)uVar168) == 0) goto LAB_01e4a88b;
                      bVar84 = bVar84 & (byte)uVar168;
                      uVar85 = (ulong)bVar84;
                      auVar162._8_4_ = 0x7f800000;
                      auVar162._0_8_ = 0x7f8000007f800000;
                      auVar162._12_4_ = 0x7f800000;
                      auVar162._16_4_ = 0x7f800000;
                      auVar162._20_4_ = 0x7f800000;
                      auVar162._24_4_ = 0x7f800000;
                      auVar162._28_4_ = 0x7f800000;
                      auVar102 = vblendmps_avx512vl(auVar162,auVar206._0_32_);
                      auVar137._0_4_ =
                           (uint)(bVar84 & 1) * auVar102._0_4_ |
                           (uint)!(bool)(bVar84 & 1) * 0x7f800000;
                      bVar21 = (bool)(bVar84 >> 1 & 1);
                      auVar137._4_4_ = (uint)bVar21 * auVar102._4_4_ | (uint)!bVar21 * 0x7f800000;
                      bVar21 = (bool)(bVar84 >> 2 & 1);
                      auVar137._8_4_ = (uint)bVar21 * auVar102._8_4_ | (uint)!bVar21 * 0x7f800000;
                      bVar21 = (bool)(bVar84 >> 3 & 1);
                      auVar137._12_4_ = (uint)bVar21 * auVar102._12_4_ | (uint)!bVar21 * 0x7f800000;
                      bVar21 = (bool)(bVar84 >> 4 & 1);
                      auVar137._16_4_ = (uint)bVar21 * auVar102._16_4_ | (uint)!bVar21 * 0x7f800000;
                      bVar21 = (bool)(bVar84 >> 5 & 1);
                      auVar137._20_4_ = (uint)bVar21 * auVar102._20_4_ | (uint)!bVar21 * 0x7f800000;
                      bVar21 = (bool)(bVar84 >> 6 & 1);
                      auVar137._24_4_ = (uint)bVar21 * auVar102._24_4_ | (uint)!bVar21 * 0x7f800000;
                      auVar137._28_4_ =
                           (uint)(bVar84 >> 7) * auVar102._28_4_ |
                           (uint)!(bool)(bVar84 >> 7) * 0x7f800000;
                      auVar102 = vshufps_avx(auVar137,auVar137,0xb1);
                      auVar102 = vminps_avx(auVar137,auVar102);
                      auVar99 = vshufpd_avx(auVar102,auVar102,5);
                      auVar102 = vminps_avx(auVar102,auVar99);
                      auVar99 = vpermpd_avx2(auVar102,0x4e);
                      auVar102 = vminps_avx(auVar102,auVar99);
                      uVar168 = vcmpps_avx512vl(auVar137,auVar102,0);
                      bVar75 = (byte)uVar168 & bVar84;
                      if (bVar75 != 0) {
                        bVar84 = bVar75;
                      }
                      uVar77 = 0;
                      for (uVar78 = (uint)bVar84; (uVar78 & 1) == 0;
                          uVar78 = uVar78 >> 1 | 0x80000000) {
                        uVar77 = uVar77 + 1;
                      }
                      uVar76 = (ulong)uVar77;
                    } while( true );
                  }
                  fVar173 = local_360[uVar76];
                  uVar149 = *(undefined4 *)(local_340 + uVar76 * 4);
                  fVar166 = 1.0 - fVar173;
                  fVar165 = fVar166 * fVar166 * -3.0;
                  auVar193 = ZEXT464((uint)fVar165);
                  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166)),
                                            ZEXT416((uint)(fVar173 * fVar166)),ZEXT416(0xc0000000));
                  auVar88 = vfmsub132ss_fma(ZEXT416((uint)(fVar173 * fVar166)),
                                            ZEXT416((uint)(fVar173 * fVar173)),ZEXT416(0x40000000));
                  fVar166 = auVar89._0_4_ * 3.0;
                  fVar167 = auVar88._0_4_ * 3.0;
                  fVar172 = fVar173 * fVar173 * 3.0;
                  auVar194._0_4_ = fVar172 * fVar147;
                  auVar194._4_4_ = fVar172 * fVar148;
                  auVar194._8_4_ = fVar172 * fVar163;
                  auVar194._12_4_ = fVar172 * fVar164;
                  auVar203 = ZEXT1664(auVar194);
                  auVar174._4_4_ = fVar167;
                  auVar174._0_4_ = fVar167;
                  auVar174._8_4_ = fVar167;
                  auVar174._12_4_ = fVar167;
                  auVar89 = vfmadd132ps_fma(auVar174,auVar194,auVar91);
                  auVar182._4_4_ = fVar166;
                  auVar182._0_4_ = fVar166;
                  auVar182._8_4_ = fVar166;
                  auVar182._12_4_ = fVar166;
                  auVar89 = vfmadd132ps_fma(auVar182,auVar89,auVar169);
                  auVar175._4_4_ = fVar165;
                  auVar175._0_4_ = fVar165;
                  auVar175._8_4_ = fVar165;
                  auVar175._12_4_ = fVar165;
                  auVar89 = vfmadd132ps_fma(auVar175,auVar89,auVar7);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar76 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar89._0_4_;
                  uVar16 = vextractps_avx(auVar89,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar16;
                  uVar16 = vextractps_avx(auVar89,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar16;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar173;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar149;
                  *(uint *)(ray + k * 4 + 0x220) = uVar14;
                  *(uint *)(ray + k * 4 + 0x240) = uVar82;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01e4a88b:
      if (8 < iVar15) {
        auVar102 = vpbroadcastd_avx512vl();
        auVar225 = ZEXT3264(auVar102);
        local_5a0._4_4_ = local_5e0._0_4_;
        local_5a0._0_4_ = local_5e0._0_4_;
        local_5a0._8_4_ = local_5e0._0_4_;
        local_5a0._12_4_ = local_5e0._0_4_;
        local_5a0._16_4_ = local_5e0._0_4_;
        local_5a0._20_4_ = local_5e0._0_4_;
        local_5a0._24_4_ = local_5e0._0_4_;
        local_5a0._28_4_ = local_5e0._0_4_;
        uStack_55c = local_560;
        uStack_558 = local_560;
        uStack_554 = local_560;
        uStack_550 = local_560;
        uStack_54c = local_560;
        uStack_548 = local_560;
        uStack_544 = local_560;
        local_120 = 1.0 / (float)local_580._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_580 = vpbroadcastd_avx512vl();
        local_540 = vpbroadcastd_avx512vl();
        lVar80 = 8;
LAB_01e4a93b:
        auVar102 = vpbroadcastd_avx512vl();
        auVar102 = vpor_avx2(auVar102,_DAT_01fe9900);
        uVar29 = vpcmpgtd_avx512vl(auVar225._0_32_,auVar102);
        auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar80 * 4 + lVar30);
        auVar99 = *(undefined1 (*) [32])(lVar30 + 0x21aa768 + lVar80 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar30 + 0x21aabec + lVar80 * 4);
        auVar101 = *(undefined1 (*) [32])(lVar30 + 0x21ab070 + lVar80 * 4);
        auVar226._0_4_ = auVar101._0_4_ * (float)local_500._0_4_;
        auVar226._4_4_ = auVar101._4_4_ * (float)local_500._4_4_;
        auVar226._8_4_ = auVar101._8_4_ * fStack_4f8;
        auVar226._12_4_ = auVar101._12_4_ * fStack_4f4;
        auVar226._16_4_ = auVar101._16_4_ * fStack_4f0;
        auVar226._20_4_ = auVar101._20_4_ * fStack_4ec;
        auVar226._28_36_ = auVar203._28_36_;
        auVar226._24_4_ = auVar101._24_4_ * fStack_4e8;
        auVar203._0_4_ = auVar101._0_4_ * (float)local_520._0_4_;
        auVar203._4_4_ = auVar101._4_4_ * (float)local_520._4_4_;
        auVar203._8_4_ = auVar101._8_4_ * fStack_518;
        auVar203._12_4_ = auVar101._12_4_ * fStack_514;
        auVar203._16_4_ = auVar101._16_4_ * fStack_510;
        auVar203._20_4_ = auVar101._20_4_ * fStack_50c;
        auVar203._28_36_ = auVar193._28_36_;
        auVar203._24_4_ = auVar101._24_4_ * fStack_508;
        auVar112 = vmulps_avx512vl(local_100,auVar101);
        auVar103 = vfmadd231ps_avx512vl(auVar226._0_32_,auVar100,local_4c0);
        auVar104 = vfmadd231ps_avx512vl(auVar203._0_32_,auVar100,local_4e0);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar100,local_e0);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar99,local_480);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar99,local_4a0);
        auVar111 = vfmadd231ps_avx512vl(auVar112,auVar99,local_c0);
        auVar89 = vfmadd231ps_fma(auVar103,auVar102,local_440);
        auVar203 = ZEXT1664(auVar89);
        auVar88 = vfmadd231ps_fma(auVar104,auVar102,local_460);
        auVar193 = ZEXT1664(auVar88);
        auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar80 * 4 + lVar30);
        auVar103 = *(undefined1 (*) [32])(lVar30 + 0x21acb88 + lVar80 * 4);
        auVar98 = vfmadd231ps_avx512vl(auVar111,auVar102,local_a0);
        auVar104 = *(undefined1 (*) [32])(lVar30 + 0x21ad00c + lVar80 * 4);
        auVar111 = *(undefined1 (*) [32])(lVar30 + 0x21ad490 + lVar80 * 4);
        auVar207._0_4_ = auVar111._0_4_ * (float)local_500._0_4_;
        auVar207._4_4_ = auVar111._4_4_ * (float)local_500._4_4_;
        auVar207._8_4_ = auVar111._8_4_ * fStack_4f8;
        auVar207._12_4_ = auVar111._12_4_ * fStack_4f4;
        auVar207._16_4_ = auVar111._16_4_ * fStack_4f0;
        auVar207._20_4_ = auVar111._20_4_ * fStack_4ec;
        auVar207._28_36_ = auVar206._28_36_;
        auVar207._24_4_ = auVar111._24_4_ * fStack_4e8;
        auVar52._4_4_ = auVar111._4_4_ * (float)local_520._4_4_;
        auVar52._0_4_ = auVar111._0_4_ * (float)local_520._0_4_;
        auVar52._8_4_ = auVar111._8_4_ * fStack_518;
        auVar52._12_4_ = auVar111._12_4_ * fStack_514;
        auVar52._16_4_ = auVar111._16_4_ * fStack_510;
        auVar52._20_4_ = auVar111._20_4_ * fStack_50c;
        auVar52._24_4_ = auVar111._24_4_ * fStack_508;
        auVar52._28_4_ = uStack_504;
        auVar105 = vmulps_avx512vl(local_100,auVar111);
        auVar106 = vfmadd231ps_avx512vl(auVar207._0_32_,auVar104,local_4c0);
        auVar107 = vfmadd231ps_avx512vl(auVar52,auVar104,local_4e0);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar104,local_e0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,local_480);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,local_4a0);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,local_c0);
        auVar6 = vfmadd231ps_fma(auVar106,auVar112,local_440);
        auVar206 = ZEXT1664(auVar6);
        auVar8 = vfmadd231ps_fma(auVar107,auVar112,local_460);
        auVar107 = vfmadd231ps_avx512vl(auVar105,auVar112,local_a0);
        auVar108 = vmaxps_avx512vl(auVar98,auVar107);
        auVar105 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar89));
        auVar106 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar88));
        auVar96 = vmulps_avx512vl(ZEXT1632(auVar88),auVar105);
        auVar97 = vmulps_avx512vl(ZEXT1632(auVar89),auVar106);
        auVar96 = vsubps_avx512vl(auVar96,auVar97);
        auVar97 = vmulps_avx512vl(auVar106,auVar106);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar105,auVar105);
        auVar108 = vmulps_avx512vl(auVar108,auVar108);
        auVar108 = vmulps_avx512vl(auVar108,auVar97);
        auVar96 = vmulps_avx512vl(auVar96,auVar96);
        uVar168 = vcmpps_avx512vl(auVar96,auVar108,2);
        bVar84 = (byte)uVar29 & (byte)uVar168;
        if (bVar84 != 0) {
          auVar111 = vmulps_avx512vl(local_2e0,auVar111);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_2c0,auVar111);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_2a0,auVar104);
          auVar112 = vfmadd213ps_avx512vl(auVar112,local_280,auVar103);
          auVar101 = vmulps_avx512vl(local_2e0,auVar101);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_2c0,auVar101);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_2a0,auVar100);
          auVar103 = vfmadd213ps_avx512vl(auVar102,local_280,auVar99);
          auVar102 = *(undefined1 (*) [32])(lVar30 + 0x21ab4f4 + lVar80 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar30 + 0x21ab978 + lVar80 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar30 + 0x21abdfc + lVar80 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar30 + 0x21ac280 + lVar80 * 4);
          auVar104 = vmulps_avx512vl(_local_500,auVar101);
          auVar111 = vmulps_avx512vl(_local_520,auVar101);
          auVar101 = vmulps_avx512vl(local_2e0,auVar101);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar100,local_4c0);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar100,local_4e0);
          auVar100 = vfmadd231ps_avx512vl(auVar101,local_2c0,auVar100);
          auVar101 = vfmadd231ps_avx512vl(auVar104,auVar99,local_480);
          auVar104 = vfmadd231ps_avx512vl(auVar111,auVar99,local_4a0);
          auVar99 = vfmadd231ps_avx512vl(auVar100,local_2a0,auVar99);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar102,local_440);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,local_460);
          auVar111 = vfmadd231ps_avx512vl(auVar99,local_280,auVar102);
          auVar102 = *(undefined1 (*) [32])(lVar30 + 0x21ad914 + lVar80 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar30 + 0x21ae21c + lVar80 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar30 + 0x21ae6a0 + lVar80 * 4);
          auVar108 = vmulps_avx512vl(_local_500,auVar100);
          auVar96 = vmulps_avx512vl(_local_520,auVar100);
          auVar100 = vmulps_avx512vl(local_2e0,auVar100);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar99,local_4c0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,local_4e0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,local_2c0,auVar99);
          auVar99 = *(undefined1 (*) [32])(lVar30 + 0x21add98 + lVar80 * 4);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar99,local_480);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,local_4a0);
          auVar99 = vfmadd231ps_avx512vl(auVar100,local_2a0,auVar99);
          auVar100 = vfmadd231ps_avx512vl(auVar108,auVar102,local_440);
          auVar108 = vfmadd231ps_avx512vl(auVar96,auVar102,local_460);
          auVar99 = vfmadd231ps_avx512vl(auVar99,local_280,auVar102);
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar101,auVar96);
          vandps_avx512vl(auVar104,auVar96);
          auVar102 = vmaxps_avx(auVar96,auVar96);
          vandps_avx512vl(auVar111,auVar96);
          auVar102 = vmaxps_avx(auVar102,auVar96);
          uVar76 = vcmpps_avx512vl(auVar102,local_5a0,1);
          bVar21 = (bool)((byte)uVar76 & 1);
          auVar125._0_4_ = (float)((uint)bVar21 * auVar105._0_4_ | (uint)!bVar21 * auVar101._0_4_);
          bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar21 * auVar105._4_4_ | (uint)!bVar21 * auVar101._4_4_);
          bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar21 * auVar105._8_4_ | (uint)!bVar21 * auVar101._8_4_);
          bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar125._12_4_ =
               (float)((uint)bVar21 * auVar105._12_4_ | (uint)!bVar21 * auVar101._12_4_);
          bVar21 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar125._16_4_ =
               (float)((uint)bVar21 * auVar105._16_4_ | (uint)!bVar21 * auVar101._16_4_);
          bVar21 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar125._20_4_ =
               (float)((uint)bVar21 * auVar105._20_4_ | (uint)!bVar21 * auVar101._20_4_);
          bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar125._24_4_ =
               (float)((uint)bVar21 * auVar105._24_4_ | (uint)!bVar21 * auVar101._24_4_);
          bVar21 = SUB81(uVar76 >> 7,0);
          auVar125._28_4_ = (uint)bVar21 * auVar105._28_4_ | (uint)!bVar21 * auVar101._28_4_;
          bVar21 = (bool)((byte)uVar76 & 1);
          auVar126._0_4_ = (float)((uint)bVar21 * auVar106._0_4_ | (uint)!bVar21 * auVar104._0_4_);
          bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar21 * auVar106._4_4_ | (uint)!bVar21 * auVar104._4_4_);
          bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar21 * auVar106._8_4_ | (uint)!bVar21 * auVar104._8_4_);
          bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar126._12_4_ =
               (float)((uint)bVar21 * auVar106._12_4_ | (uint)!bVar21 * auVar104._12_4_);
          bVar21 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar126._16_4_ =
               (float)((uint)bVar21 * auVar106._16_4_ | (uint)!bVar21 * auVar104._16_4_);
          bVar21 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar126._20_4_ =
               (float)((uint)bVar21 * auVar106._20_4_ | (uint)!bVar21 * auVar104._20_4_);
          bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar126._24_4_ =
               (float)((uint)bVar21 * auVar106._24_4_ | (uint)!bVar21 * auVar104._24_4_);
          bVar21 = SUB81(uVar76 >> 7,0);
          auVar126._28_4_ = (uint)bVar21 * auVar106._28_4_ | (uint)!bVar21 * auVar104._28_4_;
          vandps_avx512vl(auVar100,auVar96);
          vandps_avx512vl(auVar108,auVar96);
          auVar102 = vmaxps_avx(auVar126,auVar126);
          vandps_avx512vl(auVar99,auVar96);
          auVar102 = vmaxps_avx(auVar102,auVar126);
          uVar76 = vcmpps_avx512vl(auVar102,local_5a0,1);
          bVar21 = (bool)((byte)uVar76 & 1);
          auVar127._0_4_ = (uint)bVar21 * auVar105._0_4_ | (uint)!bVar21 * auVar100._0_4_;
          bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar21 * auVar105._4_4_ | (uint)!bVar21 * auVar100._4_4_;
          bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar21 * auVar105._8_4_ | (uint)!bVar21 * auVar100._8_4_;
          bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar21 * auVar105._12_4_ | (uint)!bVar21 * auVar100._12_4_;
          bVar21 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar127._16_4_ = (uint)bVar21 * auVar105._16_4_ | (uint)!bVar21 * auVar100._16_4_;
          bVar21 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar127._20_4_ = (uint)bVar21 * auVar105._20_4_ | (uint)!bVar21 * auVar100._20_4_;
          bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar127._24_4_ = (uint)bVar21 * auVar105._24_4_ | (uint)!bVar21 * auVar100._24_4_;
          bVar21 = SUB81(uVar76 >> 7,0);
          auVar127._28_4_ = (uint)bVar21 * auVar105._28_4_ | (uint)!bVar21 * auVar100._28_4_;
          bVar21 = (bool)((byte)uVar76 & 1);
          auVar128._0_4_ = (float)((uint)bVar21 * auVar106._0_4_ | (uint)!bVar21 * auVar108._0_4_);
          bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar21 * auVar106._4_4_ | (uint)!bVar21 * auVar108._4_4_);
          bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar21 * auVar106._8_4_ | (uint)!bVar21 * auVar108._8_4_);
          bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar128._12_4_ =
               (float)((uint)bVar21 * auVar106._12_4_ | (uint)!bVar21 * auVar108._12_4_);
          bVar21 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar128._16_4_ =
               (float)((uint)bVar21 * auVar106._16_4_ | (uint)!bVar21 * auVar108._16_4_);
          bVar21 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar128._20_4_ =
               (float)((uint)bVar21 * auVar106._20_4_ | (uint)!bVar21 * auVar108._20_4_);
          bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar128._24_4_ =
               (float)((uint)bVar21 * auVar106._24_4_ | (uint)!bVar21 * auVar108._24_4_);
          bVar21 = SUB81(uVar76 >> 7,0);
          auVar128._28_4_ = (uint)bVar21 * auVar106._28_4_ | (uint)!bVar21 * auVar108._28_4_;
          auVar213._8_4_ = 0x80000000;
          auVar213._0_8_ = 0x8000000080000000;
          auVar213._12_4_ = 0x80000000;
          auVar213._16_4_ = 0x80000000;
          auVar213._20_4_ = 0x80000000;
          auVar213._24_4_ = 0x80000000;
          auVar213._28_4_ = 0x80000000;
          auVar102 = vxorps_avx512vl(auVar127,auVar213);
          auVar95 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
          auVar99 = vfmadd213ps_avx512vl(auVar125,auVar125,ZEXT1632(auVar95));
          auVar9 = vfmadd231ps_fma(auVar99,auVar126,auVar126);
          auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar9));
          auVar223._8_4_ = 0xbf000000;
          auVar223._0_8_ = 0xbf000000bf000000;
          auVar223._12_4_ = 0xbf000000;
          auVar223._16_4_ = 0xbf000000;
          auVar223._20_4_ = 0xbf000000;
          auVar223._24_4_ = 0xbf000000;
          auVar223._28_4_ = 0xbf000000;
          fVar173 = auVar99._0_4_;
          fVar165 = auVar99._4_4_;
          fVar166 = auVar99._8_4_;
          fVar167 = auVar99._12_4_;
          fVar172 = auVar99._16_4_;
          fVar180 = auVar99._20_4_;
          fVar86 = auVar99._24_4_;
          auVar53._4_4_ = fVar165 * fVar165 * fVar165 * auVar9._4_4_ * -0.5;
          auVar53._0_4_ = fVar173 * fVar173 * fVar173 * auVar9._0_4_ * -0.5;
          auVar53._8_4_ = fVar166 * fVar166 * fVar166 * auVar9._8_4_ * -0.5;
          auVar53._12_4_ = fVar167 * fVar167 * fVar167 * auVar9._12_4_ * -0.5;
          auVar53._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar53._20_4_ = fVar180 * fVar180 * fVar180 * -0.0;
          auVar53._24_4_ = fVar86 * fVar86 * fVar86 * -0.0;
          auVar53._28_4_ = auVar126._28_4_;
          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar99 = vfmadd231ps_avx512vl(auVar53,auVar100,auVar99);
          auVar54._4_4_ = auVar126._4_4_ * auVar99._4_4_;
          auVar54._0_4_ = auVar126._0_4_ * auVar99._0_4_;
          auVar54._8_4_ = auVar126._8_4_ * auVar99._8_4_;
          auVar54._12_4_ = auVar126._12_4_ * auVar99._12_4_;
          auVar54._16_4_ = auVar126._16_4_ * auVar99._16_4_;
          auVar54._20_4_ = auVar126._20_4_ * auVar99._20_4_;
          auVar54._24_4_ = auVar126._24_4_ * auVar99._24_4_;
          auVar54._28_4_ = 0;
          auVar55._4_4_ = auVar99._4_4_ * -auVar125._4_4_;
          auVar55._0_4_ = auVar99._0_4_ * -auVar125._0_4_;
          auVar55._8_4_ = auVar99._8_4_ * -auVar125._8_4_;
          auVar55._12_4_ = auVar99._12_4_ * -auVar125._12_4_;
          auVar55._16_4_ = auVar99._16_4_ * -auVar125._16_4_;
          auVar55._20_4_ = auVar99._20_4_ * -auVar125._20_4_;
          auVar55._24_4_ = auVar99._24_4_ * -auVar125._24_4_;
          auVar55._28_4_ = auVar126._28_4_;
          auVar101 = vmulps_avx512vl(auVar99,ZEXT1632(auVar95));
          auVar111 = ZEXT1632(auVar95);
          auVar99 = vfmadd213ps_avx512vl(auVar127,auVar127,auVar111);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar128,auVar128);
          auVar104 = vrsqrt14ps_avx512vl(auVar99);
          auVar99 = vmulps_avx512vl(auVar99,auVar223);
          fVar173 = auVar104._0_4_;
          fVar165 = auVar104._4_4_;
          fVar166 = auVar104._8_4_;
          fVar167 = auVar104._12_4_;
          fVar172 = auVar104._16_4_;
          fVar180 = auVar104._20_4_;
          fVar86 = auVar104._24_4_;
          auVar56._4_4_ = fVar165 * fVar165 * fVar165 * auVar99._4_4_;
          auVar56._0_4_ = fVar173 * fVar173 * fVar173 * auVar99._0_4_;
          auVar56._8_4_ = fVar166 * fVar166 * fVar166 * auVar99._8_4_;
          auVar56._12_4_ = fVar167 * fVar167 * fVar167 * auVar99._12_4_;
          auVar56._16_4_ = fVar172 * fVar172 * fVar172 * auVar99._16_4_;
          auVar56._20_4_ = fVar180 * fVar180 * fVar180 * auVar99._20_4_;
          auVar56._24_4_ = fVar86 * fVar86 * fVar86 * auVar99._24_4_;
          auVar56._28_4_ = auVar99._28_4_;
          auVar99 = vfmadd231ps_avx512vl(auVar56,auVar100,auVar104);
          auVar57._4_4_ = auVar128._4_4_ * auVar99._4_4_;
          auVar57._0_4_ = auVar128._0_4_ * auVar99._0_4_;
          auVar57._8_4_ = auVar128._8_4_ * auVar99._8_4_;
          auVar57._12_4_ = auVar128._12_4_ * auVar99._12_4_;
          auVar57._16_4_ = auVar128._16_4_ * auVar99._16_4_;
          auVar57._20_4_ = auVar128._20_4_ * auVar99._20_4_;
          auVar57._24_4_ = auVar128._24_4_ * auVar99._24_4_;
          auVar57._28_4_ = auVar104._28_4_;
          auVar58._4_4_ = auVar99._4_4_ * auVar102._4_4_;
          auVar58._0_4_ = auVar99._0_4_ * auVar102._0_4_;
          auVar58._8_4_ = auVar99._8_4_ * auVar102._8_4_;
          auVar58._12_4_ = auVar99._12_4_ * auVar102._12_4_;
          auVar58._16_4_ = auVar99._16_4_ * auVar102._16_4_;
          auVar58._20_4_ = auVar99._20_4_ * auVar102._20_4_;
          auVar58._24_4_ = auVar99._24_4_ * auVar102._24_4_;
          auVar58._28_4_ = auVar102._28_4_;
          auVar102 = vmulps_avx512vl(auVar99,auVar111);
          auVar9 = vfmadd213ps_fma(auVar54,auVar98,ZEXT1632(auVar89));
          auVar10 = vfmadd213ps_fma(auVar55,auVar98,ZEXT1632(auVar88));
          auVar100 = vfmadd213ps_avx512vl(auVar101,auVar98,auVar103);
          auVar104 = vfmadd213ps_avx512vl(auVar57,auVar107,ZEXT1632(auVar6));
          auVar12 = vfnmadd213ps_fma(auVar54,auVar98,ZEXT1632(auVar89));
          auVar89 = vfmadd213ps_fma(auVar58,auVar107,ZEXT1632(auVar8));
          auVar150 = vfnmadd213ps_fma(auVar55,auVar98,ZEXT1632(auVar88));
          auVar88 = vfmadd213ps_fma(auVar102,auVar107,auVar112);
          auVar93 = vfnmadd231ps_fma(auVar103,auVar98,auVar101);
          auVar90 = vfnmadd213ps_fma(auVar57,auVar107,ZEXT1632(auVar6));
          auVar92 = vfnmadd213ps_fma(auVar58,auVar107,ZEXT1632(auVar8));
          auVar94 = vfnmadd231ps_fma(auVar112,auVar107,auVar102);
          auVar112 = vsubps_avx512vl(auVar104,ZEXT1632(auVar12));
          auVar102 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar150));
          auVar99 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar93));
          auVar59._4_4_ = auVar102._4_4_ * auVar93._4_4_;
          auVar59._0_4_ = auVar102._0_4_ * auVar93._0_4_;
          auVar59._8_4_ = auVar102._8_4_ * auVar93._8_4_;
          auVar59._12_4_ = auVar102._12_4_ * auVar93._12_4_;
          auVar59._16_4_ = auVar102._16_4_ * 0.0;
          auVar59._20_4_ = auVar102._20_4_ * 0.0;
          auVar59._24_4_ = auVar102._24_4_ * 0.0;
          auVar59._28_4_ = auVar101._28_4_;
          auVar6 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar150),auVar99);
          auVar60._4_4_ = auVar99._4_4_ * auVar12._4_4_;
          auVar60._0_4_ = auVar99._0_4_ * auVar12._0_4_;
          auVar60._8_4_ = auVar99._8_4_ * auVar12._8_4_;
          auVar60._12_4_ = auVar99._12_4_ * auVar12._12_4_;
          auVar60._16_4_ = auVar99._16_4_ * 0.0;
          auVar60._20_4_ = auVar99._20_4_ * 0.0;
          auVar60._24_4_ = auVar99._24_4_ * 0.0;
          auVar60._28_4_ = auVar99._28_4_;
          auVar8 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar93),auVar112);
          auVar61._4_4_ = auVar150._4_4_ * auVar112._4_4_;
          auVar61._0_4_ = auVar150._0_4_ * auVar112._0_4_;
          auVar61._8_4_ = auVar150._8_4_ * auVar112._8_4_;
          auVar61._12_4_ = auVar150._12_4_ * auVar112._12_4_;
          auVar61._16_4_ = auVar112._16_4_ * 0.0;
          auVar61._20_4_ = auVar112._20_4_ * 0.0;
          auVar61._24_4_ = auVar112._24_4_ * 0.0;
          auVar61._28_4_ = auVar112._28_4_;
          auVar11 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar12),auVar102);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar111,ZEXT1632(auVar8));
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar111,ZEXT1632(auVar6));
          auVar96 = ZEXT1632(auVar95);
          uVar76 = vcmpps_avx512vl(auVar102,auVar96,2);
          bVar75 = (byte)uVar76;
          fVar139 = (float)((uint)(bVar75 & 1) * auVar9._0_4_ |
                           (uint)!(bool)(bVar75 & 1) * auVar90._0_4_);
          bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
          fVar141 = (float)((uint)bVar21 * auVar9._4_4_ | (uint)!bVar21 * auVar90._4_4_);
          bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
          fVar144 = (float)((uint)bVar21 * auVar9._8_4_ | (uint)!bVar21 * auVar90._8_4_);
          bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
          fVar145 = (float)((uint)bVar21 * auVar9._12_4_ | (uint)!bVar21 * auVar90._12_4_);
          auVar111 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar144,CONCAT44(fVar141,fVar139))));
          fVar140 = (float)((uint)(bVar75 & 1) * auVar10._0_4_ |
                           (uint)!(bool)(bVar75 & 1) * auVar92._0_4_);
          bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
          fVar143 = (float)((uint)bVar21 * auVar10._4_4_ | (uint)!bVar21 * auVar92._4_4_);
          bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
          fVar142 = (float)((uint)bVar21 * auVar10._8_4_ | (uint)!bVar21 * auVar92._8_4_);
          bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
          fVar146 = (float)((uint)bVar21 * auVar10._12_4_ | (uint)!bVar21 * auVar92._12_4_);
          auVar105 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar142,CONCAT44(fVar143,fVar140))));
          auVar129._0_4_ =
               (float)((uint)(bVar75 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar75 & 1) * auVar94._0_4_);
          bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar21 * auVar100._4_4_ | (uint)!bVar21 * auVar94._4_4_);
          bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar21 * auVar100._8_4_ | (uint)!bVar21 * auVar94._8_4_);
          bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar129._12_4_ = (float)((uint)bVar21 * auVar100._12_4_ | (uint)!bVar21 * auVar94._12_4_)
          ;
          fVar166 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar100._16_4_);
          auVar129._16_4_ = fVar166;
          fVar165 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar100._20_4_);
          auVar129._20_4_ = fVar165;
          fVar173 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar100._24_4_);
          auVar129._24_4_ = fVar173;
          iVar1 = (uint)(byte)(uVar76 >> 7) * auVar100._28_4_;
          auVar129._28_4_ = iVar1;
          auVar102 = vblendmps_avx512vl(ZEXT1632(auVar12),auVar104);
          auVar130._0_4_ =
               (uint)(bVar75 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar6._0_4_;
          bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar21 * auVar102._4_4_ | (uint)!bVar21 * auVar6._4_4_;
          bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar21 * auVar102._8_4_ | (uint)!bVar21 * auVar6._8_4_;
          bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar21 * auVar102._12_4_ | (uint)!bVar21 * auVar6._12_4_;
          auVar130._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar102._16_4_;
          auVar130._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar102._20_4_;
          auVar130._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar102._24_4_;
          auVar130._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar102._28_4_;
          auVar102 = vblendmps_avx512vl(ZEXT1632(auVar150),ZEXT1632(auVar89));
          auVar131._0_4_ =
               (float)((uint)(bVar75 & 1) * auVar102._0_4_ |
                      (uint)!(bool)(bVar75 & 1) * auVar9._0_4_);
          bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar131._4_4_ = (float)((uint)bVar21 * auVar102._4_4_ | (uint)!bVar21 * auVar9._4_4_);
          bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar131._8_4_ = (float)((uint)bVar21 * auVar102._8_4_ | (uint)!bVar21 * auVar9._8_4_);
          bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar131._12_4_ = (float)((uint)bVar21 * auVar102._12_4_ | (uint)!bVar21 * auVar9._12_4_);
          fVar180 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar102._16_4_);
          auVar131._16_4_ = fVar180;
          fVar172 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar102._20_4_);
          auVar131._20_4_ = fVar172;
          fVar167 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar102._24_4_);
          auVar131._24_4_ = fVar167;
          auVar131._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar102._28_4_;
          auVar102 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar88));
          auVar132._0_4_ =
               (float)((uint)(bVar75 & 1) * auVar102._0_4_ |
                      (uint)!(bool)(bVar75 & 1) * auVar10._0_4_);
          bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar132._4_4_ = (float)((uint)bVar21 * auVar102._4_4_ | (uint)!bVar21 * auVar10._4_4_);
          bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar132._8_4_ = (float)((uint)bVar21 * auVar102._8_4_ | (uint)!bVar21 * auVar10._8_4_);
          bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar132._12_4_ = (float)((uint)bVar21 * auVar102._12_4_ | (uint)!bVar21 * auVar10._12_4_)
          ;
          fVar86 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar102._16_4_);
          auVar132._16_4_ = fVar86;
          fVar87 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar102._20_4_);
          auVar132._20_4_ = fVar87;
          fVar138 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar102._24_4_);
          auVar132._24_4_ = fVar138;
          iVar2 = (uint)(byte)(uVar76 >> 7) * auVar102._28_4_;
          auVar132._28_4_ = iVar2;
          auVar133._0_4_ =
               (uint)(bVar75 & 1) * (int)auVar12._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar104._0_4_;
          bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar21 * (int)auVar12._4_4_ | (uint)!bVar21 * auVar104._4_4_;
          bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar21 * (int)auVar12._8_4_ | (uint)!bVar21 * auVar104._8_4_;
          bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar21 * (int)auVar12._12_4_ | (uint)!bVar21 * auVar104._12_4_;
          auVar133._16_4_ = (uint)!(bool)((byte)(uVar76 >> 4) & 1) * auVar104._16_4_;
          auVar133._20_4_ = (uint)!(bool)((byte)(uVar76 >> 5) & 1) * auVar104._20_4_;
          auVar133._24_4_ = (uint)!(bool)((byte)(uVar76 >> 6) & 1) * auVar104._24_4_;
          auVar133._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar104._28_4_;
          bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
          bVar23 = (bool)((byte)(uVar76 >> 2) & 1);
          bVar25 = (bool)((byte)(uVar76 >> 3) & 1);
          bVar22 = (bool)((byte)(uVar76 >> 1) & 1);
          bVar24 = (bool)((byte)(uVar76 >> 2) & 1);
          bVar26 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar104 = vsubps_avx512vl(auVar133,auVar111);
          auVar99 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar25 * (int)auVar150._12_4_ |
                                                  (uint)!bVar25 * auVar89._12_4_,
                                                  CONCAT48((uint)bVar23 * (int)auVar150._8_4_ |
                                                           (uint)!bVar23 * auVar89._8_4_,
                                                           CONCAT44((uint)bVar21 *
                                                                    (int)auVar150._4_4_ |
                                                                    (uint)!bVar21 * auVar89._4_4_,
                                                                    (uint)(bVar75 & 1) *
                                                                    (int)auVar150._0_4_ |
                                                                    (uint)!(bool)(bVar75 & 1) *
                                                                    auVar89._0_4_)))),auVar105);
          auVar203 = ZEXT3264(auVar99);
          auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar26 * (int)auVar93._12_4_ |
                                                   (uint)!bVar26 * auVar88._12_4_,
                                                   CONCAT48((uint)bVar24 * (int)auVar93._8_4_ |
                                                            (uint)!bVar24 * auVar88._8_4_,
                                                            CONCAT44((uint)bVar22 *
                                                                     (int)auVar93._4_4_ |
                                                                     (uint)!bVar22 * auVar88._4_4_,
                                                                     (uint)(bVar75 & 1) *
                                                                     (int)auVar93._0_4_ |
                                                                     (uint)!(bool)(bVar75 & 1) *
                                                                     auVar88._0_4_)))),auVar129);
          auVar101 = vsubps_avx(auVar111,auVar130);
          auVar206 = ZEXT3264(auVar101);
          auVar112 = vsubps_avx(auVar105,auVar131);
          auVar103 = vsubps_avx(auVar129,auVar132);
          auVar62._4_4_ = auVar100._4_4_ * fVar141;
          auVar62._0_4_ = auVar100._0_4_ * fVar139;
          auVar62._8_4_ = auVar100._8_4_ * fVar144;
          auVar62._12_4_ = auVar100._12_4_ * fVar145;
          auVar62._16_4_ = auVar100._16_4_ * 0.0;
          auVar62._20_4_ = auVar100._20_4_ * 0.0;
          auVar62._24_4_ = auVar100._24_4_ * 0.0;
          auVar62._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar62,auVar129,auVar104);
          auVar186._0_4_ = fVar140 * auVar104._0_4_;
          auVar186._4_4_ = fVar143 * auVar104._4_4_;
          auVar186._8_4_ = fVar142 * auVar104._8_4_;
          auVar186._12_4_ = fVar146 * auVar104._12_4_;
          auVar186._16_4_ = auVar104._16_4_ * 0.0;
          auVar186._20_4_ = auVar104._20_4_ * 0.0;
          auVar186._24_4_ = auVar104._24_4_ * 0.0;
          auVar186._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar186,auVar111,auVar99);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar96,ZEXT1632(auVar89));
          auVar189._0_4_ = auVar99._0_4_ * auVar129._0_4_;
          auVar189._4_4_ = auVar99._4_4_ * auVar129._4_4_;
          auVar189._8_4_ = auVar99._8_4_ * auVar129._8_4_;
          auVar189._12_4_ = auVar99._12_4_ * auVar129._12_4_;
          auVar189._16_4_ = auVar99._16_4_ * fVar166;
          auVar189._20_4_ = auVar99._20_4_ * fVar165;
          auVar189._24_4_ = auVar99._24_4_ * fVar173;
          auVar189._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar189,auVar105,auVar100);
          auVar106 = vfmadd231ps_avx512vl(auVar102,auVar96,ZEXT1632(auVar89));
          auVar102 = vmulps_avx512vl(auVar103,auVar130);
          auVar102 = vfmsub231ps_avx512vl(auVar102,auVar101,auVar132);
          auVar63._4_4_ = auVar112._4_4_ * auVar132._4_4_;
          auVar63._0_4_ = auVar112._0_4_ * auVar132._0_4_;
          auVar63._8_4_ = auVar112._8_4_ * auVar132._8_4_;
          auVar63._12_4_ = auVar112._12_4_ * auVar132._12_4_;
          auVar63._16_4_ = auVar112._16_4_ * fVar86;
          auVar63._20_4_ = auVar112._20_4_ * fVar87;
          auVar63._24_4_ = auVar112._24_4_ * fVar138;
          auVar63._28_4_ = iVar2;
          auVar89 = vfmsub231ps_fma(auVar63,auVar131,auVar103);
          auVar190._0_4_ = auVar131._0_4_ * auVar101._0_4_;
          auVar190._4_4_ = auVar131._4_4_ * auVar101._4_4_;
          auVar190._8_4_ = auVar131._8_4_ * auVar101._8_4_;
          auVar190._12_4_ = auVar131._12_4_ * auVar101._12_4_;
          auVar190._16_4_ = fVar180 * auVar101._16_4_;
          auVar190._20_4_ = fVar172 * auVar101._20_4_;
          auVar190._24_4_ = fVar167 * auVar101._24_4_;
          auVar190._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar190,auVar112,auVar130);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar96,auVar102);
          auVar108 = vfmadd231ps_avx512vl(auVar102,auVar96,ZEXT1632(auVar89));
          auVar193 = ZEXT3264(auVar108);
          auVar102 = vmaxps_avx(auVar106,auVar108);
          uVar168 = vcmpps_avx512vl(auVar102,auVar96,2);
          bVar84 = bVar84 & (byte)uVar168;
          if (bVar84 != 0) {
            uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar224._4_4_ = uVar149;
            auVar224._0_4_ = uVar149;
            auVar224._8_4_ = uVar149;
            auVar224._12_4_ = uVar149;
            auVar224._16_4_ = uVar149;
            auVar224._20_4_ = uVar149;
            auVar224._24_4_ = uVar149;
            auVar224._28_4_ = uVar149;
            auVar226 = ZEXT3264(auVar224);
            auVar64._4_4_ = auVar103._4_4_ * auVar99._4_4_;
            auVar64._0_4_ = auVar103._0_4_ * auVar99._0_4_;
            auVar64._8_4_ = auVar103._8_4_ * auVar99._8_4_;
            auVar64._12_4_ = auVar103._12_4_ * auVar99._12_4_;
            auVar64._16_4_ = auVar103._16_4_ * auVar99._16_4_;
            auVar64._20_4_ = auVar103._20_4_ * auVar99._20_4_;
            auVar64._24_4_ = auVar103._24_4_ * auVar99._24_4_;
            auVar64._28_4_ = auVar102._28_4_;
            auVar8 = vfmsub231ps_fma(auVar64,auVar112,auVar100);
            auVar65._4_4_ = auVar100._4_4_ * auVar101._4_4_;
            auVar65._0_4_ = auVar100._0_4_ * auVar101._0_4_;
            auVar65._8_4_ = auVar100._8_4_ * auVar101._8_4_;
            auVar65._12_4_ = auVar100._12_4_ * auVar101._12_4_;
            auVar65._16_4_ = auVar100._16_4_ * auVar101._16_4_;
            auVar65._20_4_ = auVar100._20_4_ * auVar101._20_4_;
            auVar65._24_4_ = auVar100._24_4_ * auVar101._24_4_;
            auVar65._28_4_ = auVar100._28_4_;
            auVar6 = vfmsub231ps_fma(auVar65,auVar104,auVar103);
            auVar66._4_4_ = auVar112._4_4_ * auVar104._4_4_;
            auVar66._0_4_ = auVar112._0_4_ * auVar104._0_4_;
            auVar66._8_4_ = auVar112._8_4_ * auVar104._8_4_;
            auVar66._12_4_ = auVar112._12_4_ * auVar104._12_4_;
            auVar66._16_4_ = auVar112._16_4_ * auVar104._16_4_;
            auVar66._20_4_ = auVar112._20_4_ * auVar104._20_4_;
            auVar66._24_4_ = auVar112._24_4_ * auVar104._24_4_;
            auVar66._28_4_ = auVar112._28_4_;
            auVar9 = vfmsub231ps_fma(auVar66,auVar101,auVar99);
            auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar9));
            auVar88 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar8),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar102 = vrcp14ps_avx512vl(ZEXT1632(auVar88));
            auVar100 = auVar227._0_32_;
            auVar99 = vfnmadd213ps_avx512vl(auVar102,ZEXT1632(auVar88),auVar100);
            auVar89 = vfmadd132ps_fma(auVar99,auVar102,auVar102);
            auVar203 = ZEXT1664(auVar89);
            auVar67._4_4_ = auVar9._4_4_ * auVar129._4_4_;
            auVar67._0_4_ = auVar9._0_4_ * auVar129._0_4_;
            auVar67._8_4_ = auVar9._8_4_ * auVar129._8_4_;
            auVar67._12_4_ = auVar9._12_4_ * auVar129._12_4_;
            auVar67._16_4_ = fVar166 * 0.0;
            auVar67._20_4_ = fVar165 * 0.0;
            auVar67._24_4_ = fVar173 * 0.0;
            auVar67._28_4_ = iVar1;
            auVar6 = vfmadd231ps_fma(auVar67,auVar105,ZEXT1632(auVar6));
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar111,ZEXT1632(auVar8));
            fVar173 = auVar89._0_4_;
            fVar165 = auVar89._4_4_;
            fVar166 = auVar89._8_4_;
            fVar167 = auVar89._12_4_;
            local_5c0._28_4_ = auVar102._28_4_;
            local_5c0._0_28_ =
                 ZEXT1628(CONCAT412(auVar6._12_4_ * fVar167,
                                    CONCAT48(auVar6._8_4_ * fVar166,
                                             CONCAT44(auVar6._4_4_ * fVar165,auVar6._0_4_ * fVar173)
                                            )));
            auVar206 = ZEXT3264(local_5c0);
            uVar168 = vcmpps_avx512vl(local_5c0,auVar224,2);
            auVar74._4_4_ = uStack_55c;
            auVar74._0_4_ = local_560;
            auVar74._8_4_ = uStack_558;
            auVar74._12_4_ = uStack_554;
            auVar74._16_4_ = uStack_550;
            auVar74._20_4_ = uStack_54c;
            auVar74._24_4_ = uStack_548;
            auVar74._28_4_ = uStack_544;
            uVar29 = vcmpps_avx512vl(local_5c0,auVar74,0xd);
            bVar84 = (byte)uVar168 & (byte)uVar29 & bVar84;
            if (bVar84 != 0) {
              uVar85 = vcmpps_avx512vl(ZEXT1632(auVar88),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar85 = bVar84 & uVar85;
              if ((char)uVar85 != '\0') {
                fVar172 = auVar106._0_4_ * fVar173;
                fVar180 = auVar106._4_4_ * fVar165;
                auVar68._4_4_ = fVar180;
                auVar68._0_4_ = fVar172;
                fVar86 = auVar106._8_4_ * fVar166;
                auVar68._8_4_ = fVar86;
                fVar87 = auVar106._12_4_ * fVar167;
                auVar68._12_4_ = fVar87;
                fVar138 = auVar106._16_4_ * 0.0;
                auVar68._16_4_ = fVar138;
                fVar139 = auVar106._20_4_ * 0.0;
                auVar68._20_4_ = fVar139;
                fVar140 = auVar106._24_4_ * 0.0;
                auVar68._24_4_ = fVar140;
                auVar68._28_4_ = auVar106._28_4_;
                auVar102 = vsubps_avx512vl(auVar100,auVar68);
                local_420._0_4_ =
                     (float)((uint)(bVar75 & 1) * (int)fVar172 |
                            (uint)!(bool)(bVar75 & 1) * auVar102._0_4_);
                bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
                local_420._4_4_ =
                     (float)((uint)bVar21 * (int)fVar180 | (uint)!bVar21 * auVar102._4_4_);
                bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
                local_420._8_4_ =
                     (float)((uint)bVar21 * (int)fVar86 | (uint)!bVar21 * auVar102._8_4_);
                bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
                local_420._12_4_ =
                     (float)((uint)bVar21 * (int)fVar87 | (uint)!bVar21 * auVar102._12_4_);
                bVar21 = (bool)((byte)(uVar76 >> 4) & 1);
                local_420._16_4_ =
                     (float)((uint)bVar21 * (int)fVar138 | (uint)!bVar21 * auVar102._16_4_);
                bVar21 = (bool)((byte)(uVar76 >> 5) & 1);
                local_420._20_4_ =
                     (float)((uint)bVar21 * (int)fVar139 | (uint)!bVar21 * auVar102._20_4_);
                bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
                local_420._24_4_ =
                     (float)((uint)bVar21 * (int)fVar140 | (uint)!bVar21 * auVar102._24_4_);
                bVar21 = SUB81(uVar76 >> 7,0);
                local_420._28_4_ =
                     (float)((uint)bVar21 * auVar106._28_4_ | (uint)!bVar21 * auVar102._28_4_);
                auVar102 = vsubps_avx(auVar107,auVar98);
                auVar89 = vfmadd213ps_fma(auVar102,local_420,auVar98);
                uVar149 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar34._4_4_ = uVar149;
                auVar34._0_4_ = uVar149;
                auVar34._8_4_ = uVar149;
                auVar34._12_4_ = uVar149;
                auVar34._16_4_ = uVar149;
                auVar34._20_4_ = uVar149;
                auVar34._24_4_ = uVar149;
                auVar34._28_4_ = uVar149;
                auVar102 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                              CONCAT48(auVar89._8_4_ + auVar89._8_4_
                                                                       ,CONCAT44(auVar89._4_4_ +
                                                                                 auVar89._4_4_,
                                                                                 auVar89._0_4_ +
                                                                                 auVar89._0_4_)))),
                                           auVar34);
                uVar28 = vcmpps_avx512vl(local_5c0,auVar102,6);
                uVar85 = uVar85 & uVar28;
                bVar84 = (byte)uVar85;
                if (bVar84 != 0) {
                  auVar171._0_4_ = auVar108._0_4_ * fVar173;
                  auVar171._4_4_ = auVar108._4_4_ * fVar165;
                  auVar171._8_4_ = auVar108._8_4_ * fVar166;
                  auVar171._12_4_ = auVar108._12_4_ * fVar167;
                  auVar171._16_4_ = auVar108._16_4_ * 0.0;
                  auVar171._20_4_ = auVar108._20_4_ * 0.0;
                  auVar171._24_4_ = auVar108._24_4_ * 0.0;
                  auVar171._28_4_ = 0;
                  auVar102 = vsubps_avx512vl(auVar100,auVar171);
                  auVar134._0_4_ =
                       (uint)(bVar75 & 1) * (int)auVar171._0_4_ |
                       (uint)!(bool)(bVar75 & 1) * auVar102._0_4_;
                  bVar21 = (bool)((byte)(uVar76 >> 1) & 1);
                  auVar134._4_4_ =
                       (uint)bVar21 * (int)auVar171._4_4_ | (uint)!bVar21 * auVar102._4_4_;
                  bVar21 = (bool)((byte)(uVar76 >> 2) & 1);
                  auVar134._8_4_ =
                       (uint)bVar21 * (int)auVar171._8_4_ | (uint)!bVar21 * auVar102._8_4_;
                  bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
                  auVar134._12_4_ =
                       (uint)bVar21 * (int)auVar171._12_4_ | (uint)!bVar21 * auVar102._12_4_;
                  bVar21 = (bool)((byte)(uVar76 >> 4) & 1);
                  auVar134._16_4_ =
                       (uint)bVar21 * (int)auVar171._16_4_ | (uint)!bVar21 * auVar102._16_4_;
                  bVar21 = (bool)((byte)(uVar76 >> 5) & 1);
                  auVar134._20_4_ =
                       (uint)bVar21 * (int)auVar171._20_4_ | (uint)!bVar21 * auVar102._20_4_;
                  bVar21 = (bool)((byte)(uVar76 >> 6) & 1);
                  auVar134._24_4_ =
                       (uint)bVar21 * (int)auVar171._24_4_ | (uint)!bVar21 * auVar102._24_4_;
                  auVar134._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar102._28_4_;
                  auVar35._8_4_ = 0x40000000;
                  auVar35._0_8_ = 0x4000000040000000;
                  auVar35._12_4_ = 0x40000000;
                  auVar35._16_4_ = 0x40000000;
                  auVar35._20_4_ = 0x40000000;
                  auVar35._24_4_ = 0x40000000;
                  auVar35._28_4_ = 0x40000000;
                  local_400 = vfmsub132ps_avx512vl(auVar134,auVar100,auVar35);
                  local_3c0 = (undefined4)lVar80;
                  local_3b0 = local_690;
                  uStack_3a8 = uStack_688;
                  local_3a0 = local_6b0;
                  uStack_398 = uStack_6a8;
                  local_390 = local_6c0;
                  uStack_388 = uStack_6b8;
                  local_380 = local_6a0;
                  uStack_378 = uStack_698;
                  pGVar81 = (context->scene->geometries).items[uVar82].ptr;
                  if ((pGVar81->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar89 = vcvtsi2ss_avx512f(auVar95,local_3c0);
                    fVar173 = auVar89._0_4_;
                    local_360[0] = (fVar173 + local_420._0_4_ + 0.0) * local_120;
                    local_360[1] = (fVar173 + local_420._4_4_ + 1.0) * fStack_11c;
                    local_360[2] = (fVar173 + local_420._8_4_ + 2.0) * fStack_118;
                    local_360[3] = (fVar173 + local_420._12_4_ + 3.0) * fStack_114;
                    fStack_350 = (fVar173 + local_420._16_4_ + 4.0) * fStack_110;
                    fStack_34c = (fVar173 + local_420._20_4_ + 5.0) * fStack_10c;
                    fStack_348 = (fVar173 + local_420._24_4_ + 6.0) * fStack_108;
                    fStack_344 = fVar173 + local_420._28_4_ + 7.0;
                    local_340 = local_400;
                    local_320 = local_5c0;
                    auVar158._8_4_ = 0x7f800000;
                    auVar158._0_8_ = 0x7f8000007f800000;
                    auVar158._12_4_ = 0x7f800000;
                    auVar158._16_4_ = 0x7f800000;
                    auVar158._20_4_ = 0x7f800000;
                    auVar158._24_4_ = 0x7f800000;
                    auVar158._28_4_ = 0x7f800000;
                    auVar102 = vblendmps_avx512vl(auVar158,local_5c0);
                    auVar135._0_4_ =
                         (uint)(bVar84 & 1) * auVar102._0_4_ |
                         (uint)!(bool)(bVar84 & 1) * 0x7f800000;
                    bVar21 = (bool)((byte)(uVar85 >> 1) & 1);
                    auVar135._4_4_ = (uint)bVar21 * auVar102._4_4_ | (uint)!bVar21 * 0x7f800000;
                    bVar21 = (bool)((byte)(uVar85 >> 2) & 1);
                    auVar135._8_4_ = (uint)bVar21 * auVar102._8_4_ | (uint)!bVar21 * 0x7f800000;
                    bVar21 = (bool)((byte)(uVar85 >> 3) & 1);
                    auVar135._12_4_ = (uint)bVar21 * auVar102._12_4_ | (uint)!bVar21 * 0x7f800000;
                    bVar21 = (bool)((byte)(uVar85 >> 4) & 1);
                    auVar135._16_4_ = (uint)bVar21 * auVar102._16_4_ | (uint)!bVar21 * 0x7f800000;
                    bVar21 = (bool)((byte)(uVar85 >> 5) & 1);
                    auVar135._20_4_ = (uint)bVar21 * auVar102._20_4_ | (uint)!bVar21 * 0x7f800000;
                    bVar21 = (bool)((byte)(uVar85 >> 6) & 1);
                    auVar135._24_4_ = (uint)bVar21 * auVar102._24_4_ | (uint)!bVar21 * 0x7f800000;
                    bVar21 = SUB81(uVar85 >> 7,0);
                    auVar135._28_4_ = (uint)bVar21 * auVar102._28_4_ | (uint)!bVar21 * 0x7f800000;
                    auVar102 = vshufps_avx(auVar135,auVar135,0xb1);
                    auVar102 = vminps_avx(auVar135,auVar102);
                    auVar99 = vshufpd_avx(auVar102,auVar102,5);
                    auVar102 = vminps_avx(auVar102,auVar99);
                    auVar99 = vpermpd_avx2(auVar102,0x4e);
                    auVar102 = vminps_avx(auVar102,auVar99);
                    uVar168 = vcmpps_avx512vl(auVar135,auVar102,0);
                    uVar77 = (uint)uVar85;
                    if (((byte)uVar168 & bVar84) != 0) {
                      uVar77 = (uint)((byte)uVar168 & bVar84);
                    }
                    uVar78 = 0;
                    for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                      uVar78 = uVar78 + 1;
                    }
                    uVar76 = (ulong)uVar78;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar81->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_140 = vmovdqa64_avx512vl(auVar225._0_32_);
                      local_600._0_8_ = pGVar81;
                      local_3e0 = local_5c0;
                      local_3bc = iVar15;
                      do {
                        local_200 = local_360[uVar76];
                        local_1e0 = *(undefined4 *)(local_340 + uVar76 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_320 + uVar76 * 4);
                        local_678.context = context->user;
                        fVar165 = 1.0 - local_200;
                        fVar173 = fVar165 * fVar165 * -3.0;
                        auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165)),
                                                  ZEXT416((uint)(local_200 * fVar165)),
                                                  ZEXT416(0xc0000000));
                        auVar88 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar165)),
                                                  ZEXT416((uint)(local_200 * local_200)),
                                                  ZEXT416(0x40000000));
                        fVar165 = auVar89._0_4_ * 3.0;
                        fVar166 = auVar88._0_4_ * 3.0;
                        fVar167 = local_200 * local_200 * 3.0;
                        auVar196._0_4_ = fVar167 * fVar147;
                        auVar196._4_4_ = fVar167 * fVar148;
                        auVar196._8_4_ = fVar167 * fVar163;
                        auVar196._12_4_ = fVar167 * fVar164;
                        auVar151._4_4_ = fVar166;
                        auVar151._0_4_ = fVar166;
                        auVar151._8_4_ = fVar166;
                        auVar151._12_4_ = fVar166;
                        auVar89 = vfmadd132ps_fma(auVar151,auVar196,auVar91);
                        auVar184._4_4_ = fVar165;
                        auVar184._0_4_ = fVar165;
                        auVar184._8_4_ = fVar165;
                        auVar184._12_4_ = fVar165;
                        auVar89 = vfmadd132ps_fma(auVar184,auVar89,auVar169);
                        auVar152._4_4_ = fVar173;
                        auVar152._0_4_ = fVar173;
                        auVar152._8_4_ = fVar173;
                        auVar152._12_4_ = fVar173;
                        auVar89 = vfmadd132ps_fma(auVar152,auVar89,auVar7);
                        local_260 = auVar89._0_4_;
                        auVar191._8_4_ = 1;
                        auVar191._0_8_ = 0x100000001;
                        auVar191._12_4_ = 1;
                        auVar191._16_4_ = 1;
                        auVar191._20_4_ = 1;
                        auVar191._24_4_ = 1;
                        auVar191._28_4_ = 1;
                        local_240 = vpermps_avx2(auVar191,ZEXT1632(auVar89));
                        auVar193 = ZEXT3264(local_240);
                        auVar197._8_4_ = 2;
                        auVar197._0_8_ = 0x200000002;
                        auVar197._12_4_ = 2;
                        auVar201._16_4_ = 2;
                        auVar201._0_16_ = auVar197;
                        auVar201._20_4_ = 2;
                        auVar201._24_4_ = 2;
                        auVar201._28_4_ = 2;
                        auVar203 = ZEXT3264(auVar201);
                        local_220 = vpermps_avx2(auVar201,ZEXT1632(auVar89));
                        iStack_25c = local_260;
                        iStack_258 = local_260;
                        iStack_254 = local_260;
                        iStack_250 = local_260;
                        iStack_24c = local_260;
                        iStack_248 = local_260;
                        iStack_244 = local_260;
                        fStack_1fc = local_200;
                        fStack_1f8 = local_200;
                        fStack_1f4 = local_200;
                        fStack_1f0 = local_200;
                        fStack_1ec = local_200;
                        fStack_1e8 = local_200;
                        fStack_1e4 = local_200;
                        uStack_1dc = local_1e0;
                        uStack_1d8 = local_1e0;
                        uStack_1d4 = local_1e0;
                        uStack_1d0 = local_1e0;
                        uStack_1cc = local_1e0;
                        uStack_1c8 = local_1e0;
                        uStack_1c4 = local_1e0;
                        local_1c0 = local_540._0_8_;
                        uStack_1b8 = local_540._8_8_;
                        uStack_1b0 = local_540._16_8_;
                        uStack_1a8 = local_540._24_8_;
                        local_1a0 = local_580;
                        auVar102 = vpcmpeqd_avx2(local_580,local_580);
                        local_648[1] = auVar102;
                        *local_648 = auVar102;
                        local_180 = (local_678.context)->instID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_160 = (local_678.context)->instPrimID[0];
                        uStack_15c = local_160;
                        uStack_158 = local_160;
                        uStack_154 = local_160;
                        uStack_150 = local_160;
                        uStack_14c = local_160;
                        uStack_148 = local_160;
                        uStack_144 = local_160;
                        local_640 = local_300;
                        local_678.valid = (int *)local_640;
                        local_678.geometryUserPtr = pGVar81->userPtr;
                        local_678.hit = (RTCHitN *)&local_260;
                        local_678.N = 8;
                        local_5e0 = auVar226._0_32_;
                        local_678.ray = (RTCRayN *)ray;
                        if (pGVar81->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar193 = ZEXT1664(local_240._0_16_);
                          auVar203 = ZEXT1664(auVar197);
                          (*pGVar81->intersectionFilterN)(&local_678);
                          auVar206 = ZEXT3264(local_5c0);
                          auVar226 = ZEXT3264(local_5e0);
                          pGVar81 = (Geometry *)local_600._0_8_;
                        }
                        if (local_640 == (undefined1  [32])0x0) {
LAB_01e4b4f1:
                          *(int *)(ray + k * 4 + 0x100) = auVar226._0_4_;
                        }
                        else {
                          p_Var20 = context->args->filter;
                          if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar81->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar193 = ZEXT1664(auVar193._0_16_);
                            auVar203 = ZEXT1664(auVar203._0_16_);
                            (*p_Var20)(&local_678);
                            auVar206 = ZEXT3264(local_5c0);
                            auVar226 = ZEXT3264(local_5e0);
                            pGVar81 = (Geometry *)local_600._0_8_;
                          }
                          if (local_640 == (undefined1  [32])0x0) goto LAB_01e4b4f1;
                          uVar28 = vptestmd_avx512vl(local_640,local_640);
                          iVar1 = *(int *)(local_678.hit + 4);
                          iVar2 = *(int *)(local_678.hit + 8);
                          iVar69 = *(int *)(local_678.hit + 0xc);
                          iVar70 = *(int *)(local_678.hit + 0x10);
                          iVar71 = *(int *)(local_678.hit + 0x14);
                          iVar72 = *(int *)(local_678.hit + 0x18);
                          iVar73 = *(int *)(local_678.hit + 0x1c);
                          bVar84 = (byte)uVar28;
                          bVar21 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar24 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar25 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar26 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar27 = SUB81(uVar28 >> 7,0);
                          *(uint *)(local_678.ray + 0x180) =
                               (uint)(bVar84 & 1) * *(int *)local_678.hit |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_678.ray + 0x180);
                          *(uint *)(local_678.ray + 0x184) =
                               (uint)bVar21 * iVar1 |
                               (uint)!bVar21 * *(int *)(local_678.ray + 0x184);
                          *(uint *)(local_678.ray + 0x188) =
                               (uint)bVar22 * iVar2 |
                               (uint)!bVar22 * *(int *)(local_678.ray + 0x188);
                          *(uint *)(local_678.ray + 0x18c) =
                               (uint)bVar23 * iVar69 |
                               (uint)!bVar23 * *(int *)(local_678.ray + 0x18c);
                          *(uint *)(local_678.ray + 400) =
                               (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_678.ray + 400)
                          ;
                          *(uint *)(local_678.ray + 0x194) =
                               (uint)bVar25 * iVar71 |
                               (uint)!bVar25 * *(int *)(local_678.ray + 0x194);
                          *(uint *)(local_678.ray + 0x198) =
                               (uint)bVar26 * iVar72 |
                               (uint)!bVar26 * *(int *)(local_678.ray + 0x198);
                          *(uint *)(local_678.ray + 0x19c) =
                               (uint)bVar27 * iVar73 |
                               (uint)!bVar27 * *(int *)(local_678.ray + 0x19c);
                          iVar1 = *(int *)(local_678.hit + 0x24);
                          iVar2 = *(int *)(local_678.hit + 0x28);
                          iVar69 = *(int *)(local_678.hit + 0x2c);
                          iVar70 = *(int *)(local_678.hit + 0x30);
                          iVar71 = *(int *)(local_678.hit + 0x34);
                          iVar72 = *(int *)(local_678.hit + 0x38);
                          iVar73 = *(int *)(local_678.hit + 0x3c);
                          bVar21 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar24 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar25 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar26 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar27 = SUB81(uVar28 >> 7,0);
                          *(uint *)(local_678.ray + 0x1a0) =
                               (uint)(bVar84 & 1) * *(int *)(local_678.hit + 0x20) |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_678.ray + 0x1a0);
                          *(uint *)(local_678.ray + 0x1a4) =
                               (uint)bVar21 * iVar1 |
                               (uint)!bVar21 * *(int *)(local_678.ray + 0x1a4);
                          *(uint *)(local_678.ray + 0x1a8) =
                               (uint)bVar22 * iVar2 |
                               (uint)!bVar22 * *(int *)(local_678.ray + 0x1a8);
                          *(uint *)(local_678.ray + 0x1ac) =
                               (uint)bVar23 * iVar69 |
                               (uint)!bVar23 * *(int *)(local_678.ray + 0x1ac);
                          *(uint *)(local_678.ray + 0x1b0) =
                               (uint)bVar24 * iVar70 |
                               (uint)!bVar24 * *(int *)(local_678.ray + 0x1b0);
                          *(uint *)(local_678.ray + 0x1b4) =
                               (uint)bVar25 * iVar71 |
                               (uint)!bVar25 * *(int *)(local_678.ray + 0x1b4);
                          *(uint *)(local_678.ray + 0x1b8) =
                               (uint)bVar26 * iVar72 |
                               (uint)!bVar26 * *(int *)(local_678.ray + 0x1b8);
                          *(uint *)(local_678.ray + 0x1bc) =
                               (uint)bVar27 * iVar73 |
                               (uint)!bVar27 * *(int *)(local_678.ray + 0x1bc);
                          iVar1 = *(int *)(local_678.hit + 0x44);
                          iVar2 = *(int *)(local_678.hit + 0x48);
                          iVar69 = *(int *)(local_678.hit + 0x4c);
                          iVar70 = *(int *)(local_678.hit + 0x50);
                          iVar71 = *(int *)(local_678.hit + 0x54);
                          iVar72 = *(int *)(local_678.hit + 0x58);
                          iVar73 = *(int *)(local_678.hit + 0x5c);
                          bVar21 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar24 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar25 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar26 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar27 = SUB81(uVar28 >> 7,0);
                          *(uint *)(local_678.ray + 0x1c0) =
                               (uint)(bVar84 & 1) * *(int *)(local_678.hit + 0x40) |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_678.ray + 0x1c0);
                          *(uint *)(local_678.ray + 0x1c4) =
                               (uint)bVar21 * iVar1 |
                               (uint)!bVar21 * *(int *)(local_678.ray + 0x1c4);
                          *(uint *)(local_678.ray + 0x1c8) =
                               (uint)bVar22 * iVar2 |
                               (uint)!bVar22 * *(int *)(local_678.ray + 0x1c8);
                          *(uint *)(local_678.ray + 0x1cc) =
                               (uint)bVar23 * iVar69 |
                               (uint)!bVar23 * *(int *)(local_678.ray + 0x1cc);
                          *(uint *)(local_678.ray + 0x1d0) =
                               (uint)bVar24 * iVar70 |
                               (uint)!bVar24 * *(int *)(local_678.ray + 0x1d0);
                          *(uint *)(local_678.ray + 0x1d4) =
                               (uint)bVar25 * iVar71 |
                               (uint)!bVar25 * *(int *)(local_678.ray + 0x1d4);
                          *(uint *)(local_678.ray + 0x1d8) =
                               (uint)bVar26 * iVar72 |
                               (uint)!bVar26 * *(int *)(local_678.ray + 0x1d8);
                          *(uint *)(local_678.ray + 0x1dc) =
                               (uint)bVar27 * iVar73 |
                               (uint)!bVar27 * *(int *)(local_678.ray + 0x1dc);
                          iVar1 = *(int *)(local_678.hit + 100);
                          iVar2 = *(int *)(local_678.hit + 0x68);
                          iVar69 = *(int *)(local_678.hit + 0x6c);
                          iVar70 = *(int *)(local_678.hit + 0x70);
                          iVar71 = *(int *)(local_678.hit + 0x74);
                          iVar72 = *(int *)(local_678.hit + 0x78);
                          iVar73 = *(int *)(local_678.hit + 0x7c);
                          bVar21 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar24 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar25 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar26 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar27 = SUB81(uVar28 >> 7,0);
                          *(uint *)(local_678.ray + 0x1e0) =
                               (uint)(bVar84 & 1) * *(int *)(local_678.hit + 0x60) |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_678.ray + 0x1e0);
                          *(uint *)(local_678.ray + 0x1e4) =
                               (uint)bVar21 * iVar1 |
                               (uint)!bVar21 * *(int *)(local_678.ray + 0x1e4);
                          *(uint *)(local_678.ray + 0x1e8) =
                               (uint)bVar22 * iVar2 |
                               (uint)!bVar22 * *(int *)(local_678.ray + 0x1e8);
                          *(uint *)(local_678.ray + 0x1ec) =
                               (uint)bVar23 * iVar69 |
                               (uint)!bVar23 * *(int *)(local_678.ray + 0x1ec);
                          *(uint *)(local_678.ray + 0x1f0) =
                               (uint)bVar24 * iVar70 |
                               (uint)!bVar24 * *(int *)(local_678.ray + 0x1f0);
                          *(uint *)(local_678.ray + 500) =
                               (uint)bVar25 * iVar71 | (uint)!bVar25 * *(int *)(local_678.ray + 500)
                          ;
                          *(uint *)(local_678.ray + 0x1f8) =
                               (uint)bVar26 * iVar72 |
                               (uint)!bVar26 * *(int *)(local_678.ray + 0x1f8);
                          *(uint *)(local_678.ray + 0x1fc) =
                               (uint)bVar27 * iVar73 |
                               (uint)!bVar27 * *(int *)(local_678.ray + 0x1fc);
                          iVar1 = *(int *)(local_678.hit + 0x84);
                          iVar2 = *(int *)(local_678.hit + 0x88);
                          iVar69 = *(int *)(local_678.hit + 0x8c);
                          iVar70 = *(int *)(local_678.hit + 0x90);
                          iVar71 = *(int *)(local_678.hit + 0x94);
                          iVar72 = *(int *)(local_678.hit + 0x98);
                          iVar73 = *(int *)(local_678.hit + 0x9c);
                          bVar21 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar24 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar25 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar26 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar27 = SUB81(uVar28 >> 7,0);
                          *(uint *)(local_678.ray + 0x200) =
                               (uint)(bVar84 & 1) * *(int *)(local_678.hit + 0x80) |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_678.ray + 0x200);
                          *(uint *)(local_678.ray + 0x204) =
                               (uint)bVar21 * iVar1 |
                               (uint)!bVar21 * *(int *)(local_678.ray + 0x204);
                          *(uint *)(local_678.ray + 0x208) =
                               (uint)bVar22 * iVar2 |
                               (uint)!bVar22 * *(int *)(local_678.ray + 0x208);
                          *(uint *)(local_678.ray + 0x20c) =
                               (uint)bVar23 * iVar69 |
                               (uint)!bVar23 * *(int *)(local_678.ray + 0x20c);
                          *(uint *)(local_678.ray + 0x210) =
                               (uint)bVar24 * iVar70 |
                               (uint)!bVar24 * *(int *)(local_678.ray + 0x210);
                          *(uint *)(local_678.ray + 0x214) =
                               (uint)bVar25 * iVar71 |
                               (uint)!bVar25 * *(int *)(local_678.ray + 0x214);
                          *(uint *)(local_678.ray + 0x218) =
                               (uint)bVar26 * iVar72 |
                               (uint)!bVar26 * *(int *)(local_678.ray + 0x218);
                          *(uint *)(local_678.ray + 0x21c) =
                               (uint)bVar27 * iVar73 |
                               (uint)!bVar27 * *(int *)(local_678.ray + 0x21c);
                          auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_678.ray + 0x220) = auVar102;
                          auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_678.ray + 0x240) = auVar102;
                          auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_678.ray + 0x260) = auVar102;
                          auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_678.hit + 0x100));
                          *(undefined1 (*) [32])(local_678.ray + 0x280) = auVar102;
                          auVar226 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                        }
                        bVar84 = ~(byte)(1 << ((uint)uVar76 & 0x1f)) & (byte)uVar85;
                        uVar149 = auVar226._0_4_;
                        auVar159._4_4_ = uVar149;
                        auVar159._0_4_ = uVar149;
                        auVar159._8_4_ = uVar149;
                        auVar159._12_4_ = uVar149;
                        auVar159._16_4_ = uVar149;
                        auVar159._20_4_ = uVar149;
                        auVar159._24_4_ = uVar149;
                        auVar159._28_4_ = uVar149;
                        uVar168 = vcmpps_avx512vl(auVar206._0_32_,auVar159,2);
                        if ((bVar84 & (byte)uVar168) == 0) goto LAB_01e4b589;
                        bVar84 = bVar84 & (byte)uVar168;
                        uVar85 = (ulong)bVar84;
                        auVar160._8_4_ = 0x7f800000;
                        auVar160._0_8_ = 0x7f8000007f800000;
                        auVar160._12_4_ = 0x7f800000;
                        auVar160._16_4_ = 0x7f800000;
                        auVar160._20_4_ = 0x7f800000;
                        auVar160._24_4_ = 0x7f800000;
                        auVar160._28_4_ = 0x7f800000;
                        auVar102 = vblendmps_avx512vl(auVar160,auVar206._0_32_);
                        auVar136._0_4_ =
                             (uint)(bVar84 & 1) * auVar102._0_4_ |
                             (uint)!(bool)(bVar84 & 1) * 0x7f800000;
                        bVar21 = (bool)(bVar84 >> 1 & 1);
                        auVar136._4_4_ = (uint)bVar21 * auVar102._4_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar84 >> 2 & 1);
                        auVar136._8_4_ = (uint)bVar21 * auVar102._8_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar84 >> 3 & 1);
                        auVar136._12_4_ =
                             (uint)bVar21 * auVar102._12_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar84 >> 4 & 1);
                        auVar136._16_4_ =
                             (uint)bVar21 * auVar102._16_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar84 >> 5 & 1);
                        auVar136._20_4_ =
                             (uint)bVar21 * auVar102._20_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar84 >> 6 & 1);
                        auVar136._24_4_ =
                             (uint)bVar21 * auVar102._24_4_ | (uint)!bVar21 * 0x7f800000;
                        auVar136._28_4_ =
                             (uint)(bVar84 >> 7) * auVar102._28_4_ |
                             (uint)!(bool)(bVar84 >> 7) * 0x7f800000;
                        auVar102 = vshufps_avx(auVar136,auVar136,0xb1);
                        auVar102 = vminps_avx(auVar136,auVar102);
                        auVar99 = vshufpd_avx(auVar102,auVar102,5);
                        auVar102 = vminps_avx(auVar102,auVar99);
                        auVar99 = vpermpd_avx2(auVar102,0x4e);
                        auVar102 = vminps_avx(auVar102,auVar99);
                        uVar168 = vcmpps_avx512vl(auVar136,auVar102,0);
                        bVar75 = (byte)uVar168 & bVar84;
                        if (bVar75 != 0) {
                          bVar84 = bVar75;
                        }
                        uVar77 = 0;
                        for (uVar78 = (uint)bVar84; (uVar78 & 1) == 0;
                            uVar78 = uVar78 >> 1 | 0x80000000) {
                          uVar77 = uVar77 + 1;
                        }
                        uVar76 = (ulong)uVar77;
                      } while( true );
                    }
                    fVar173 = local_360[uVar76];
                    uVar149 = *(undefined4 *)(local_340 + uVar76 * 4);
                    fVar166 = 1.0 - fVar173;
                    fVar165 = fVar166 * fVar166 * -3.0;
                    auVar193 = ZEXT464((uint)fVar165);
                    auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166)),
                                              ZEXT416((uint)(fVar173 * fVar166)),ZEXT416(0xc0000000)
                                             );
                    auVar88 = vfmsub132ss_fma(ZEXT416((uint)(fVar173 * fVar166)),
                                              ZEXT416((uint)(fVar173 * fVar173)),ZEXT416(0x40000000)
                                             );
                    fVar166 = auVar89._0_4_ * 3.0;
                    fVar167 = auVar88._0_4_ * 3.0;
                    fVar172 = fVar173 * fVar173 * 3.0;
                    auVar195._0_4_ = fVar172 * fVar147;
                    auVar195._4_4_ = fVar172 * fVar148;
                    auVar195._8_4_ = fVar172 * fVar163;
                    auVar195._12_4_ = fVar172 * fVar164;
                    auVar203 = ZEXT1664(auVar195);
                    auVar176._4_4_ = fVar167;
                    auVar176._0_4_ = fVar167;
                    auVar176._8_4_ = fVar167;
                    auVar176._12_4_ = fVar167;
                    auVar89 = vfmadd132ps_fma(auVar176,auVar195,auVar91);
                    auVar183._4_4_ = fVar166;
                    auVar183._0_4_ = fVar166;
                    auVar183._8_4_ = fVar166;
                    auVar183._12_4_ = fVar166;
                    auVar89 = vfmadd132ps_fma(auVar183,auVar89,auVar169);
                    auVar177._4_4_ = fVar165;
                    auVar177._0_4_ = fVar165;
                    auVar177._8_4_ = fVar165;
                    auVar177._12_4_ = fVar165;
                    auVar89 = vfmadd132ps_fma(auVar177,auVar89,auVar7);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar76 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar89._0_4_;
                    uVar16 = vextractps_avx(auVar89,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar16;
                    uVar16 = vextractps_avx(auVar89,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar16;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar173;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar149;
                    *(uint *)(ray + k * 4 + 0x220) = uVar14;
                    *(uint *)(ray + k * 4 + 0x240) = uVar82;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01e4b1ce;
      }
LAB_01e4a895:
      uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar33._4_4_ = uVar149;
      auVar33._0_4_ = uVar149;
      auVar33._8_4_ = uVar149;
      auVar33._12_4_ = uVar149;
      auVar33._16_4_ = uVar149;
      auVar33._20_4_ = uVar149;
      auVar33._24_4_ = uVar149;
      auVar33._28_4_ = uVar149;
      uVar168 = vcmpps_avx512vl(local_80,auVar33,2);
      uVar82 = (uint)uVar83 & (uint)uVar83 + 0xff & (uint)uVar168;
      uVar83 = (ulong)uVar82;
    } while (uVar82 != 0);
  }
  return;
LAB_01e4b589:
  auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar227 = ZEXT3264(auVar102);
  auVar228 = ZEXT464(0xbf800000);
  auVar102 = vmovdqa64_avx512vl(local_140);
  auVar225 = ZEXT3264(auVar102);
LAB_01e4b1ce:
  lVar80 = lVar80 + 8;
  if (iVar15 <= (int)lVar80) goto LAB_01e4a895;
  goto LAB_01e4a93b;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }